

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  Primitive PVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [28];
  uint uVar93;
  uint uVar94;
  uint uVar95;
  ulong uVar96;
  long lVar97;
  ulong uVar98;
  undefined4 uVar99;
  undefined8 unaff_R13;
  ulong uVar100;
  long lVar101;
  undefined8 uVar102;
  float fVar124;
  vint4 bi_2;
  undefined1 auVar109 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined8 uVar103;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar123;
  float fVar125;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar108 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vint4 bi_1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar132 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  float fVar152;
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  vint4 ai_2;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  vint4 ai;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  vint4 bi;
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  vint4 ai_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar210;
  float fVar217;
  float fVar218;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar219;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar216 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined4 uVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined8 uVar232;
  undefined8 uVar233;
  undefined8 uVar234;
  undefined1 auVar231 [32];
  undefined1 auVar235 [64];
  float fVar236;
  float fVar242;
  float fVar243;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  float fVar244;
  undefined1 auVar240 [32];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar241 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  Precalculations *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [32];
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [12];
  uint uStack_6f4;
  undefined1 auStack_6f0 [16];
  RayHitK<4> *local_6e0;
  undefined1 (*local_6d8) [16];
  RayQueryContext *local_6d0;
  size_t local_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  LinearSpace3fa *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar13 = prim[1];
  uVar100 = (ulong)(byte)PVar13;
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar171 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar171 = vinsertps_avx(auVar171,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar20 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + uVar100 * 0x19 + 6));
  fVar153 = *(float *)(prim + uVar100 * 0x19 + 0x12);
  auVar104._0_4_ = fVar153 * auVar20._0_4_;
  auVar104._4_4_ = fVar153 * auVar20._4_4_;
  auVar104._8_4_ = fVar153 * auVar20._8_4_;
  auVar104._12_4_ = fVar153 * auVar20._12_4_;
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 4 + 6)));
  auVar191._0_4_ = fVar153 * auVar171._0_4_;
  auVar191._4_4_ = fVar153 * auVar171._4_4_;
  auVar191._8_4_ = fVar153 * auVar171._8_4_;
  auVar191._12_4_ = fVar153 * auVar171._12_4_;
  auVar171 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 5 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 6 + 6)));
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xb + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xc + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xd + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0x12 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0x13 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0x14 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar237._4_4_ = auVar191._0_4_;
  auVar237._0_4_ = auVar191._0_4_;
  auVar237._8_4_ = auVar191._0_4_;
  auVar237._12_4_ = auVar191._0_4_;
  auVar154 = vshufps_avx(auVar191,auVar191,0x55);
  auVar105 = vshufps_avx(auVar191,auVar191,0xaa);
  fVar153 = auVar105._0_4_;
  auVar223._0_4_ = fVar153 * auVar109._0_4_;
  fVar152 = auVar105._4_4_;
  auVar223._4_4_ = fVar152 * auVar109._4_4_;
  fVar123 = auVar105._8_4_;
  auVar223._8_4_ = fVar123 * auVar109._8_4_;
  fVar124 = auVar105._12_4_;
  auVar223._12_4_ = fVar124 * auVar109._12_4_;
  auVar211._0_4_ = auVar24._0_4_ * fVar153;
  auVar211._4_4_ = auVar24._4_4_ * fVar152;
  auVar211._8_4_ = auVar24._8_4_ * fVar123;
  auVar211._12_4_ = auVar24._12_4_ * fVar124;
  auVar207._0_4_ = auVar130._0_4_ * fVar153;
  auVar207._4_4_ = auVar130._4_4_ * fVar152;
  auVar207._8_4_ = auVar130._8_4_ * fVar123;
  auVar207._12_4_ = auVar130._12_4_ * fVar124;
  auVar105 = vfmadd231ps_fma(auVar223,auVar154,auVar171);
  auVar131 = vfmadd231ps_fma(auVar211,auVar154,auVar23);
  auVar154 = vfmadd231ps_fma(auVar207,auVar106,auVar154);
  auVar166 = vfmadd231ps_fma(auVar105,auVar237,auVar20);
  auVar131 = vfmadd231ps_fma(auVar131,auVar237,auVar22);
  auVar177 = vfmadd231ps_fma(auVar154,auVar107,auVar237);
  auVar238._4_4_ = auVar104._0_4_;
  auVar238._0_4_ = auVar104._0_4_;
  auVar238._8_4_ = auVar104._0_4_;
  auVar238._12_4_ = auVar104._0_4_;
  auVar154 = vshufps_avx(auVar104,auVar104,0x55);
  auVar105 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar153 = auVar105._0_4_;
  auVar192._0_4_ = fVar153 * auVar109._0_4_;
  fVar152 = auVar105._4_4_;
  auVar192._4_4_ = fVar152 * auVar109._4_4_;
  fVar123 = auVar105._8_4_;
  auVar192._8_4_ = fVar123 * auVar109._8_4_;
  fVar124 = auVar105._12_4_;
  auVar192._12_4_ = fVar124 * auVar109._12_4_;
  auVar129._0_4_ = auVar24._0_4_ * fVar153;
  auVar129._4_4_ = auVar24._4_4_ * fVar152;
  auVar129._8_4_ = auVar24._8_4_ * fVar123;
  auVar129._12_4_ = auVar24._12_4_ * fVar124;
  auVar105._0_4_ = auVar130._0_4_ * fVar153;
  auVar105._4_4_ = auVar130._4_4_ * fVar152;
  auVar105._8_4_ = auVar130._8_4_ * fVar123;
  auVar105._12_4_ = auVar130._12_4_ * fVar124;
  auVar171 = vfmadd231ps_fma(auVar192,auVar154,auVar171);
  auVar109 = vfmadd231ps_fma(auVar129,auVar154,auVar23);
  auVar23 = vfmadd231ps_fma(auVar105,auVar154,auVar106);
  auVar106 = vfmadd231ps_fma(auVar171,auVar238,auVar20);
  auVar130 = vfmadd231ps_fma(auVar109,auVar238,auVar22);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar20 = vandps_avx(auVar166,local_290);
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  auVar20 = vcmpps_avx(auVar20,auVar202,1);
  auVar171 = vblendvps_avx(auVar166,auVar202,auVar20);
  auVar20 = vandps_avx(auVar131,local_290);
  auVar20 = vcmpps_avx(auVar20,auVar202,1);
  auVar109 = vblendvps_avx(auVar131,auVar202,auVar20);
  auVar20 = vandps_avx(auVar177,local_290);
  auVar20 = vcmpps_avx(auVar20,auVar202,1);
  auVar20 = vblendvps_avx(auVar177,auVar202,auVar20);
  auVar154 = vfmadd231ps_fma(auVar23,auVar238,auVar107);
  auVar22 = vrcpps_avx(auVar171);
  auVar203._8_4_ = 0x3f800000;
  auVar203._0_8_ = 0x3f8000003f800000;
  auVar203._12_4_ = 0x3f800000;
  auVar171 = vfnmadd213ps_fma(auVar171,auVar22,auVar203);
  auVar22 = vfmadd132ps_fma(auVar171,auVar22,auVar22);
  auVar171 = vrcpps_avx(auVar109);
  auVar109 = vfnmadd213ps_fma(auVar109,auVar171,auVar203);
  auVar24 = vfmadd132ps_fma(auVar109,auVar171,auVar171);
  auVar171 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar171,auVar203);
  auVar107 = vfmadd132ps_fma(auVar20,auVar171,auVar171);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar100 * 7 + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar106);
  auVar177._0_4_ = auVar22._0_4_ * auVar20._0_4_;
  auVar177._4_4_ = auVar22._4_4_ * auVar20._4_4_;
  auVar177._8_4_ = auVar22._8_4_ * auVar20._8_4_;
  auVar177._12_4_ = auVar22._12_4_ * auVar20._12_4_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar100 * 9 + 6);
  auVar20 = vpmovsxwd_avx(auVar171);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar106);
  auVar186._0_4_ = auVar22._0_4_ * auVar20._0_4_;
  auVar186._4_4_ = auVar22._4_4_ * auVar20._4_4_;
  auVar186._8_4_ = auVar22._8_4_ * auVar20._8_4_;
  auVar186._12_4_ = auVar22._12_4_ * auVar20._12_4_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar100 * 0xe + 6);
  auVar20 = vpmovsxwd_avx(auVar109);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar130);
  auVar193._0_4_ = auVar24._0_4_ * auVar20._0_4_;
  auVar193._4_4_ = auVar24._4_4_ * auVar20._4_4_;
  auVar193._8_4_ = auVar24._8_4_ * auVar20._8_4_;
  auVar193._12_4_ = auVar24._12_4_ * auVar20._12_4_;
  auVar131._1_3_ = 0;
  auVar131[0] = PVar13;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar20 = vpmovsxwd_avx(auVar22);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar171 = vsubps_avx(auVar20,auVar130);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar100 * 0x15 + 6);
  auVar20 = vpmovsxwd_avx(auVar23);
  auVar130._0_4_ = auVar24._0_4_ * auVar171._0_4_;
  auVar130._4_4_ = auVar24._4_4_ * auVar171._4_4_;
  auVar130._8_4_ = auVar24._8_4_ * auVar171._8_4_;
  auVar130._12_4_ = auVar24._12_4_ * auVar171._12_4_;
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar154);
  auVar166._0_4_ = auVar107._0_4_ * auVar20._0_4_;
  auVar166._4_4_ = auVar107._4_4_ * auVar20._4_4_;
  auVar166._8_4_ = auVar107._8_4_ * auVar20._8_4_;
  auVar166._12_4_ = auVar107._12_4_ * auVar20._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar100 * 0x17 + 6);
  auVar20 = vpmovsxwd_avx(auVar24);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar154);
  auVar106._0_4_ = auVar107._0_4_ * auVar20._0_4_;
  auVar106._4_4_ = auVar107._4_4_ * auVar20._4_4_;
  auVar106._8_4_ = auVar107._8_4_ * auVar20._8_4_;
  auVar106._12_4_ = auVar107._12_4_ * auVar20._12_4_;
  auVar20 = vpminsd_avx(auVar177,auVar186);
  auVar171 = vpminsd_avx(auVar193,auVar130);
  auVar20 = vmaxps_avx(auVar20,auVar171);
  auVar171 = vpminsd_avx(auVar166,auVar106);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar212._4_4_ = uVar99;
  auVar212._0_4_ = uVar99;
  auVar212._8_4_ = uVar99;
  auVar212._12_4_ = uVar99;
  auVar171 = vmaxps_avx(auVar171,auVar212);
  auVar20 = vmaxps_avx(auVar20,auVar171);
  local_2a0._0_4_ = auVar20._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar20._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar20._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar20._12_4_ * 0.99999964;
  auVar20 = vpmaxsd_avx(auVar177,auVar186);
  auVar171 = vpmaxsd_avx(auVar193,auVar130);
  auVar20 = vminps_avx(auVar20,auVar171);
  auVar171 = vpmaxsd_avx(auVar166,auVar106);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar154._4_4_ = uVar99;
  auVar154._0_4_ = uVar99;
  auVar154._8_4_ = uVar99;
  auVar154._12_4_ = uVar99;
  auVar171 = vminps_avx(auVar171,auVar154);
  auVar20 = vminps_avx(auVar20,auVar171);
  auVar107._0_4_ = auVar20._0_4_ * 1.0000004;
  auVar107._4_4_ = auVar20._4_4_ * 1.0000004;
  auVar107._8_4_ = auVar20._8_4_ * 1.0000004;
  auVar107._12_4_ = auVar20._12_4_ * 1.0000004;
  auVar131[4] = PVar13;
  auVar131._5_3_ = 0;
  auVar131[8] = PVar13;
  auVar131._9_3_ = 0;
  auVar131[0xc] = PVar13;
  auVar131._13_3_ = 0;
  auVar171 = vpcmpgtd_avx(auVar131,_DAT_01f4ad30);
  auVar20 = vcmpps_avx(local_2a0,auVar107,2);
  auVar20 = vandps_avx(auVar20,auVar171);
  uVar99 = vmovmskps_avx(auVar20);
  uVar100 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar99);
  local_568 = pre->ray_space + k;
  local_560 = mm_lookupmask_ps._16_8_;
  uStack_558 = mm_lookupmask_ps._24_8_;
  uStack_550 = mm_lookupmask_ps._16_8_;
  uStack_548 = mm_lookupmask_ps._24_8_;
  local_6d8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_7b0 = pre;
  do {
    auVar113 = local_460;
    if (uVar100 == 0) {
      return;
    }
    lVar97 = 0;
    for (uVar96 = uVar100; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
      lVar97 = lVar97 + 1;
    }
    uVar94 = *(uint *)(prim + 2);
    uVar14 = *(uint *)(prim + lVar97 * 4 + 6);
    local_7a8 = (ulong)uVar14;
    pGVar17 = (context->scene->geometries).items[uVar94].ptr;
    uVar96 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                             pGVar17[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * local_7a8);
    p_Var18 = pGVar17[1].intersectionFilterN;
    lVar97 = *(long *)&pGVar17[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar97 + (long)p_Var18 * uVar96);
    uVar79 = *(undefined8 *)*pauVar1;
    uVar80 = *(undefined8 *)(*pauVar1 + 8);
    auVar130 = *pauVar1;
    auVar24 = *pauVar1;
    auVar109 = *pauVar1;
    pauVar2 = (undefined1 (*) [16])(lVar97 + (uVar96 + 1) * (long)p_Var18);
    uVar81 = *(undefined8 *)*pauVar2;
    uVar82 = *(undefined8 *)(*pauVar2 + 8);
    auVar106 = *pauVar2;
    auVar23 = *pauVar2;
    auVar171 = *pauVar2;
    pauVar3 = (undefined1 (*) [16])(lVar97 + (uVar96 + 2) * (long)p_Var18);
    uVar83 = *(undefined8 *)*pauVar3;
    uVar84 = *(undefined8 *)(*pauVar3 + 8);
    auVar107 = *pauVar3;
    auVar22 = *pauVar3;
    auVar20 = *pauVar3;
    uVar100 = uVar100 - 1 & uVar100;
    pauVar4 = (undefined1 (*) [12])(lVar97 + (uVar96 + 3) * (long)p_Var18);
    uVar85 = *(undefined8 *)*pauVar4;
    uVar86 = *(undefined8 *)(*pauVar4 + 8);
    local_840 = (float)uVar85;
    fStack_83c = (float)((ulong)uVar85 >> 0x20);
    fStack_838 = (float)uVar86;
    fStack_834 = (float)((ulong)uVar86 >> 0x20);
    if (uVar100 != 0) {
      uVar98 = uVar100 - 1 & uVar100;
      for (uVar96 = uVar100; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
      }
      if (uVar98 != 0) {
        for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar15 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar154 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar166 = vinsertps_avx(auVar154,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar105 = vsubps_avx(*pauVar1,auVar166);
    uVar99 = auVar105._0_4_;
    auVar178._4_4_ = uVar99;
    auVar178._0_4_ = uVar99;
    auVar178._8_4_ = uVar99;
    auVar178._12_4_ = uVar99;
    auVar154 = vshufps_avx(auVar105,auVar105,0x55);
    auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
    aVar8 = (local_568->vx).field_0;
    aVar9 = (local_568->vy).field_0;
    fVar153 = (local_568->vz).field_0.m128[0];
    fVar152 = *(float *)((long)&(local_568->vz).field_0 + 4);
    fVar123 = *(float *)((long)&(local_568->vz).field_0 + 8);
    fVar124 = *(float *)((long)&(local_568->vz).field_0 + 0xc);
    auVar194._0_4_ = fVar153 * auVar105._0_4_;
    auVar194._4_4_ = fVar152 * auVar105._4_4_;
    auVar194._8_4_ = fVar123 * auVar105._8_4_;
    auVar194._12_4_ = fVar124 * auVar105._12_4_;
    auVar154 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar9,auVar154);
    auVar104 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar8,auVar178);
    auVar154 = vblendps_avx(auVar104,*pauVar1,8);
    auVar131 = vsubps_avx(*pauVar2,auVar166);
    uVar99 = auVar131._0_4_;
    auVar195._4_4_ = uVar99;
    auVar195._0_4_ = uVar99;
    auVar195._8_4_ = uVar99;
    auVar195._12_4_ = uVar99;
    auVar105 = vshufps_avx(auVar131,auVar131,0x55);
    auVar131 = vshufps_avx(auVar131,auVar131,0xaa);
    auVar224._0_4_ = fVar153 * auVar131._0_4_;
    auVar224._4_4_ = fVar152 * auVar131._4_4_;
    auVar224._8_4_ = fVar123 * auVar131._8_4_;
    auVar224._12_4_ = fVar124 * auVar131._12_4_;
    auVar105 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar9,auVar105);
    auVar129 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar8,auVar195);
    auVar105 = vblendps_avx(auVar129,*pauVar2,8);
    auVar177 = vsubps_avx(*pauVar3,auVar166);
    uVar99 = auVar177._0_4_;
    auVar204._4_4_ = uVar99;
    auVar204._0_4_ = uVar99;
    auVar204._8_4_ = uVar99;
    auVar204._12_4_ = uVar99;
    auVar131 = vshufps_avx(auVar177,auVar177,0x55);
    auVar177 = vshufps_avx(auVar177,auVar177,0xaa);
    auVar228._0_4_ = fVar153 * auVar177._0_4_;
    auVar228._4_4_ = fVar152 * auVar177._4_4_;
    auVar228._8_4_ = fVar123 * auVar177._8_4_;
    auVar228._12_4_ = fVar124 * auVar177._12_4_;
    auVar131 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar9,auVar131);
    auVar186 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar8,auVar204);
    auVar131 = vblendps_avx(auVar186,*pauVar3,8);
    auVar87._12_4_ = fStack_834;
    auVar87._0_12_ = *pauVar4;
    auVar177 = vsubps_avx(auVar87,auVar166);
    uVar99 = auVar177._0_4_;
    auVar205._4_4_ = uVar99;
    auVar205._0_4_ = uVar99;
    auVar205._8_4_ = uVar99;
    auVar205._12_4_ = uVar99;
    auVar166 = vshufps_avx(auVar177,auVar177,0x55);
    auVar177 = vshufps_avx(auVar177,auVar177,0xaa);
    auVar230._0_4_ = fVar153 * auVar177._0_4_;
    auVar230._4_4_ = fVar152 * auVar177._4_4_;
    auVar230._8_4_ = fVar123 * auVar177._8_4_;
    auVar230._12_4_ = fVar124 * auVar177._12_4_;
    auVar166 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar9,auVar166);
    auVar191 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar8,auVar205);
    auVar166 = vblendps_avx(auVar191,auVar87,8);
    auVar154 = vandps_avx(auVar154,local_290);
    auVar105 = vandps_avx(auVar105,local_290);
    auVar177 = vmaxps_avx(auVar154,auVar105);
    auVar154 = vandps_avx(auVar131,local_290);
    auVar105 = vandps_avx(auVar166,local_290);
    auVar154 = vmaxps_avx(auVar154,auVar105);
    auVar154 = vmaxps_avx(auVar177,auVar154);
    auVar105 = vmovshdup_avx(auVar154);
    auVar105 = vmaxss_avx(auVar105,auVar154);
    auVar154 = vshufpd_avx(auVar154,auVar154,1);
    auVar154 = vmaxss_avx(auVar154,auVar105);
    lVar97 = (long)iVar15 * 0x44;
    auVar105 = vmovshdup_avx(auVar104);
    local_4a0 = auVar105._0_8_;
    auVar10 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar97 + 0x484);
    auVar105 = vmovshdup_avx(auVar129);
    uVar102 = auVar105._0_8_;
    local_4c0._8_8_ = uVar102;
    local_4c0._0_8_ = uVar102;
    local_4c0._16_8_ = uVar102;
    local_4c0._24_8_ = uVar102;
    auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar97 + 0x908);
    uVar227 = auVar186._0_4_;
    local_5c0._4_4_ = uVar227;
    local_5c0._0_4_ = uVar227;
    local_5c0._8_4_ = uVar227;
    local_5c0._12_4_ = uVar227;
    local_5c0._16_4_ = uVar227;
    local_5c0._20_4_ = uVar227;
    local_5c0._24_4_ = uVar227;
    local_5c0._28_4_ = uVar227;
    auVar105 = vmovshdup_avx(auVar186);
    uVar102 = auVar105._0_8_;
    local_720._8_8_ = uVar102;
    local_720._0_8_ = uVar102;
    local_720._16_8_ = uVar102;
    local_720._24_8_ = uVar102;
    fVar152 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar97 + 0xd8c);
    fVar123 = *(float *)(catmullrom_basis0 + lVar97 + 0xd90);
    fVar124 = *(float *)(catmullrom_basis0 + lVar97 + 0xd94);
    fVar125 = *(float *)(catmullrom_basis0 + lVar97 + 0xd98);
    fVar126 = *(float *)(catmullrom_basis0 + lVar97 + 0xd9c);
    fVar127 = *(float *)(catmullrom_basis0 + lVar97 + 0xda0);
    fVar128 = *(float *)(catmullrom_basis0 + lVar97 + 0xda4);
    auVar92 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar97 + 0xd8c);
    local_600 = auVar191._0_4_;
    auVar105 = vmovshdup_avx(auVar191);
    uVar103 = auVar105._0_8_;
    auVar119._0_4_ = fVar152 * local_600;
    auVar119._4_4_ = fVar123 * local_600;
    auVar119._8_4_ = fVar124 * local_600;
    auVar119._12_4_ = fVar125 * local_600;
    auVar119._16_4_ = fVar126 * local_600;
    auVar119._20_4_ = fVar127 * local_600;
    auVar119._24_4_ = fVar128 * local_600;
    auVar119._28_4_ = 0;
    local_640 = auVar105._0_4_;
    auVar110._0_4_ = local_640 * fVar152;
    fStack_63c = auVar105._4_4_;
    auVar110._4_4_ = fStack_63c * fVar123;
    auVar110._8_4_ = local_640 * fVar124;
    auVar110._12_4_ = fStack_63c * fVar125;
    auVar110._16_4_ = local_640 * fVar126;
    auVar110._20_4_ = fStack_63c * fVar127;
    auVar110._24_4_ = local_640 * fVar128;
    auVar110._28_4_ = 0;
    auVar105 = vfmadd231ps_fma(auVar119,auVar122,local_5c0);
    auVar131 = vfmadd231ps_fma(auVar110,auVar122,local_720);
    uVar99 = auVar129._0_4_;
    local_660._4_4_ = uVar99;
    local_660._0_4_ = uVar99;
    local_660._8_4_ = uVar99;
    local_660._12_4_ = uVar99;
    local_660._16_4_ = uVar99;
    local_660._20_4_ = uVar99;
    local_660._24_4_ = uVar99;
    local_660._28_4_ = uVar99;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar10,local_660);
    auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar10,local_4c0);
    auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar97);
    uVar99 = auVar104._0_4_;
    local_7a0._4_4_ = uVar99;
    local_7a0._0_4_ = uVar99;
    local_7a0._8_4_ = uVar99;
    local_7a0._12_4_ = uVar99;
    local_7a0._16_4_ = uVar99;
    local_7a0._20_4_ = uVar99;
    local_7a0._24_4_ = uVar99;
    local_7a0._28_4_ = uVar99;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar110,local_7a0);
    auVar118._8_8_ = local_4a0;
    auVar118._0_8_ = local_4a0;
    auVar118._16_8_ = local_4a0;
    auVar118._24_8_ = local_4a0;
    auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar110,auVar118);
    auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar97 + 0x908);
    fVar73 = *(float *)(catmullrom_basis1 + lVar97 + 0xd8c);
    fVar74 = *(float *)(catmullrom_basis1 + lVar97 + 0xd90);
    fVar75 = *(float *)(catmullrom_basis1 + lVar97 + 0xd94);
    fVar76 = *(float *)(catmullrom_basis1 + lVar97 + 0xd98);
    fVar77 = *(float *)(catmullrom_basis1 + lVar97 + 0xd9c);
    fVar78 = *(float *)(catmullrom_basis1 + lVar97 + 0xda0);
    fVar210 = *(float *)(catmullrom_basis1 + lVar97 + 0xda4);
    auVar117._4_4_ = local_600 * fVar74;
    auVar117._0_4_ = local_600 * fVar73;
    auVar117._8_4_ = local_600 * fVar75;
    auVar117._12_4_ = local_600 * fVar76;
    auVar117._16_4_ = local_600 * fVar77;
    auVar117._20_4_ = local_600 * fVar78;
    auVar117._24_4_ = local_600 * fVar210;
    auVar117._28_4_ = local_600;
    auVar166 = vfmadd231ps_fma(auVar117,auVar119,local_5c0);
    auVar141._4_4_ = fStack_63c * fVar74;
    auVar141._0_4_ = local_640 * fVar73;
    auVar141._8_4_ = local_640 * fVar75;
    auVar141._12_4_ = fStack_63c * fVar76;
    auVar141._16_4_ = local_640 * fVar77;
    auVar141._20_4_ = fStack_63c * fVar78;
    auVar141._24_4_ = local_640 * fVar210;
    auVar141._28_4_ = uVar227;
    auVar177 = vfmadd231ps_fma(auVar141,auVar119,local_720);
    auVar117 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar97 + 0x484);
    auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar117,local_660);
    auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar117,local_4c0);
    auVar141 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar97);
    auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar141,local_7a0);
    auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar141,auVar118);
    auVar136 = ZEXT1632(auVar166);
    auVar196 = ZEXT1632(auVar105);
    _local_340 = vsubps_avx(auVar136,auVar196);
    auVar161 = ZEXT1632(auVar177);
    auVar111 = ZEXT1632(auVar131);
    _local_2e0 = vsubps_avx(auVar161,auVar111);
    auVar112._0_4_ = local_340._0_4_ * auVar131._0_4_;
    auVar112._4_4_ = local_340._4_4_ * auVar131._4_4_;
    auVar112._8_4_ = local_340._8_4_ * auVar131._8_4_;
    auVar112._12_4_ = local_340._12_4_ * auVar131._12_4_;
    auVar112._16_4_ = local_340._16_4_ * 0.0;
    auVar112._20_4_ = local_340._20_4_ * 0.0;
    auVar112._24_4_ = local_340._24_4_ * 0.0;
    auVar112._28_4_ = 0;
    fVar217 = local_2e0._0_4_;
    auVar137._0_4_ = fVar217 * auVar105._0_4_;
    fVar218 = local_2e0._4_4_;
    auVar137._4_4_ = fVar218 * auVar105._4_4_;
    fVar219 = local_2e0._8_4_;
    auVar137._8_4_ = fVar219 * auVar105._8_4_;
    fVar220 = local_2e0._12_4_;
    auVar137._12_4_ = fVar220 * auVar105._12_4_;
    fVar221 = local_2e0._16_4_;
    auVar137._16_4_ = fVar221 * 0.0;
    fVar222 = local_2e0._20_4_;
    auVar137._20_4_ = fVar222 * 0.0;
    fVar236 = local_2e0._24_4_;
    auVar137._24_4_ = fVar236 * 0.0;
    auVar137._28_4_ = 0;
    auVar118 = vsubps_avx(auVar112,auVar137);
    auVar105 = vpermilps_avx(*pauVar1,0xff);
    uVar102 = auVar105._0_8_;
    local_80._8_8_ = uVar102;
    local_80._0_8_ = uVar102;
    local_80._16_8_ = uVar102;
    local_80._24_8_ = uVar102;
    auVar131 = vpermilps_avx(*pauVar2,0xff);
    uVar102 = auVar131._0_8_;
    local_a0._8_8_ = uVar102;
    local_a0._0_8_ = uVar102;
    local_a0._16_8_ = uVar102;
    local_a0._24_8_ = uVar102;
    auVar131 = vpermilps_avx(*pauVar3,0xff);
    uVar102 = auVar131._0_8_;
    local_c0._8_8_ = uVar102;
    local_c0._0_8_ = uVar102;
    local_c0._16_8_ = uVar102;
    local_c0._24_8_ = uVar102;
    auVar88._12_4_ = fStack_834;
    auVar88._0_12_ = *pauVar4;
    auVar131 = vpermilps_avx(auVar88,0xff);
    local_e0 = auVar131._0_8_;
    fVar153 = auVar131._0_4_;
    auVar197._0_4_ = fVar152 * fVar153;
    fVar152 = auVar131._4_4_;
    auVar197._4_4_ = fVar123 * fVar152;
    auVar197._8_4_ = fVar124 * fVar153;
    auVar197._12_4_ = fVar125 * fVar152;
    auVar197._16_4_ = fVar126 * fVar153;
    auVar197._20_4_ = fVar127 * fVar152;
    auVar197._24_4_ = fVar128 * fVar153;
    auVar197._28_4_ = 0;
    auVar131 = vfmadd231ps_fma(auVar197,local_c0,auVar122);
    auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),local_a0,auVar10);
    auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar110,local_80);
    auVar200 = ZEXT1664(auVar131);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar21._4_4_ = fVar152 * fVar74;
    auVar21._0_4_ = fVar153 * fVar73;
    auVar21._8_4_ = fVar153 * fVar75;
    auVar21._12_4_ = fVar152 * fVar76;
    auVar21._16_4_ = fVar153 * fVar77;
    auVar21._20_4_ = fVar152 * fVar78;
    auVar21._24_4_ = fVar153 * fVar210;
    auVar21._28_4_ = auVar110._28_4_;
    auVar166 = vfmadd231ps_fma(auVar21,auVar119,local_c0);
    auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar117,local_a0);
    auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar141,local_80);
    auVar19._4_4_ = fVar218 * fVar218;
    auVar19._0_4_ = fVar217 * fVar217;
    auVar19._8_4_ = fVar219 * fVar219;
    auVar19._12_4_ = fVar220 * fVar220;
    auVar19._16_4_ = fVar221 * fVar221;
    auVar19._20_4_ = fVar222 * fVar222;
    auVar19._24_4_ = fVar236 * fVar236;
    auVar19._28_4_ = auVar105._4_4_;
    auVar105 = vfmadd231ps_fma(auVar19,_local_340,_local_340);
    auVar21 = vmaxps_avx(ZEXT1632(auVar131),ZEXT1632(auVar166));
    auVar144._4_4_ = auVar21._4_4_ * auVar21._4_4_ * auVar105._4_4_;
    auVar144._0_4_ = auVar21._0_4_ * auVar21._0_4_ * auVar105._0_4_;
    auVar144._8_4_ = auVar21._8_4_ * auVar21._8_4_ * auVar105._8_4_;
    auVar144._12_4_ = auVar21._12_4_ * auVar21._12_4_ * auVar105._12_4_;
    auVar144._16_4_ = auVar21._16_4_ * auVar21._16_4_ * 0.0;
    auVar144._20_4_ = auVar21._20_4_ * auVar21._20_4_ * 0.0;
    auVar144._24_4_ = auVar21._24_4_ * auVar21._24_4_ * 0.0;
    auVar144._28_4_ = auVar21._28_4_;
    auVar146._4_4_ = auVar118._4_4_ * auVar118._4_4_;
    auVar146._0_4_ = auVar118._0_4_ * auVar118._0_4_;
    auVar146._8_4_ = auVar118._8_4_ * auVar118._8_4_;
    auVar146._12_4_ = auVar118._12_4_ * auVar118._12_4_;
    auVar146._16_4_ = auVar118._16_4_ * auVar118._16_4_;
    auVar146._20_4_ = auVar118._20_4_ * auVar118._20_4_;
    auVar146._24_4_ = auVar118._24_4_ * auVar118._24_4_;
    auVar146._28_4_ = auVar118._28_4_;
    local_460._0_4_ = (undefined4)iVar15;
    local_460._4_12_ = auVar186._4_12_;
    auVar21 = vcmpps_avx(auVar146,auVar144,2);
    fVar153 = auVar154._0_4_ * 4.7683716e-07;
    local_460._16_16_ = auVar113._16_16_;
    auVar113._4_4_ = local_460._0_4_;
    auVar113._0_4_ = local_460._0_4_;
    auVar113._8_4_ = local_460._0_4_;
    auVar113._12_4_ = local_460._0_4_;
    auVar113._16_4_ = local_460._0_4_;
    auVar113._20_4_ = local_460._0_4_;
    auVar113._24_4_ = local_460._0_4_;
    auVar113._28_4_ = local_460._0_4_;
    auVar113 = vcmpps_avx(_DAT_01f7b060,auVar113,1);
    auVar154 = vpermilps_avx(auVar104,0xaa);
    uVar102 = auVar154._0_8_;
    auVar172._8_8_ = uVar102;
    auVar172._0_8_ = uVar102;
    auVar172._16_8_ = uVar102;
    auVar172._24_8_ = uVar102;
    auVar105 = vpermilps_avx(auVar129,0xaa);
    uVar102 = auVar105._0_8_;
    auVar208._8_8_ = uVar102;
    auVar208._0_8_ = uVar102;
    auVar208._16_8_ = uVar102;
    auVar208._24_8_ = uVar102;
    auVar154 = vshufps_avx(auVar186,auVar186,0xaa);
    uVar102 = auVar154._0_8_;
    auVar229._8_8_ = uVar102;
    auVar229._0_8_ = uVar102;
    auVar229._16_8_ = uVar102;
    auVar229._24_8_ = uVar102;
    auVar154 = vshufps_avx(auVar191,auVar191,0xaa);
    uVar102 = auVar154._0_8_;
    auVar118 = auVar113 & auVar21;
    uVar99 = *(undefined4 *)(ray + k * 4 + 0x30);
    local_480._0_16_ = ZEXT416(uVar94);
    local_520._0_16_ = ZEXT416(uVar14);
    uVar232 = uVar102;
    uVar233 = uVar102;
    uVar234 = uVar102;
    fStack_638 = local_640;
    fStack_634 = fStack_63c;
    fStack_630 = local_640;
    fStack_62c = fStack_63c;
    fStack_628 = local_640;
    fStack_624 = fStack_63c;
    fStack_5fc = local_600;
    fStack_5f8 = local_600;
    fStack_5f4 = local_600;
    fStack_5f0 = local_600;
    fStack_5ec = local_600;
    fStack_5e8 = local_600;
    fStack_5e4 = local_600;
    uStack_498 = local_4a0;
    uStack_490 = local_4a0;
    uStack_488 = local_4a0;
    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar118 >> 0x7f,0) == '\0') &&
          (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar118 >> 0xbf,0) == '\0') &&
        (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar118[0x1f])
    {
      auVar151 = ZEXT3264(local_6a0);
      auVar176 = ZEXT3264(local_5c0);
      auVar206 = ZEXT3264(local_720);
      auVar216 = ZEXT3264(CONCAT428(fStack_63c,
                                    CONCAT424(local_640,
                                              CONCAT420(fStack_63c,
                                                        CONCAT416(local_640,
                                                                  CONCAT412(fStack_63c,
                                                                            CONCAT48(local_640,
                                                                                     uVar103)))))));
      auVar165 = ZEXT3264(local_660);
      auVar241 = ZEXT3264(local_7a0);
    }
    else {
      local_300 = vandps_avx(auVar21,auVar113);
      fVar217 = auVar154._0_4_;
      fVar218 = auVar154._4_4_;
      auVar25._4_4_ = fVar218 * fVar74;
      auVar25._0_4_ = fVar217 * fVar73;
      auVar25._8_4_ = fVar217 * fVar75;
      auVar25._12_4_ = fVar218 * fVar76;
      auVar25._16_4_ = fVar217 * fVar77;
      auVar25._20_4_ = fVar218 * fVar78;
      auVar25._24_4_ = fVar217 * fVar210;
      auVar25._28_4_ = local_300._28_4_;
      auVar154 = vfmadd213ps_fma(auVar119,auVar229,auVar25);
      auVar154 = vfmadd213ps_fma(auVar117,auVar208,ZEXT1632(auVar154));
      auVar154 = vfmadd213ps_fma(auVar141,auVar172,ZEXT1632(auVar154));
      local_320 = ZEXT1632(auVar154);
      local_680._0_4_ = auVar92._0_4_;
      local_680._4_4_ = auVar92._4_4_;
      fStack_678 = auVar92._8_4_;
      fStack_674 = auVar92._12_4_;
      fStack_670 = auVar92._16_4_;
      fStack_66c = auVar92._20_4_;
      fStack_668 = auVar92._24_4_;
      auVar26._4_4_ = fVar218 * (float)local_680._4_4_;
      auVar26._0_4_ = fVar217 * (float)local_680._0_4_;
      auVar26._8_4_ = fVar217 * fStack_678;
      auVar26._12_4_ = fVar218 * fStack_674;
      auVar26._16_4_ = fVar217 * fStack_670;
      auVar26._20_4_ = fVar218 * fStack_66c;
      auVar26._24_4_ = fVar217 * fStack_668;
      auVar26._28_4_ = local_300._28_4_;
      auVar154 = vfmadd213ps_fma(auVar122,auVar229,auVar26);
      auVar154 = vfmadd213ps_fma(auVar10,auVar208,ZEXT1632(auVar154));
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar97 + 0x1210);
      auVar10 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar97 + 0x1694);
      auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar97 + 0x1b18);
      fVar152 = *(float *)(catmullrom_basis0 + lVar97 + 0x1f9c);
      fVar123 = *(float *)(catmullrom_basis0 + lVar97 + 0x1fa0);
      fVar124 = *(float *)(catmullrom_basis0 + lVar97 + 0x1fa4);
      fVar125 = *(float *)(catmullrom_basis0 + lVar97 + 0x1fa8);
      fVar126 = *(float *)(catmullrom_basis0 + lVar97 + 0x1fac);
      fVar127 = *(float *)(catmullrom_basis0 + lVar97 + 0x1fb0);
      fVar128 = *(float *)(catmullrom_basis0 + lVar97 + 0x1fb4);
      auVar187._0_4_ = local_600 * fVar152;
      auVar187._4_4_ = local_600 * fVar123;
      auVar187._8_4_ = local_600 * fVar124;
      auVar187._12_4_ = local_600 * fVar125;
      auVar187._16_4_ = local_600 * fVar126;
      auVar187._20_4_ = local_600 * fVar127;
      auVar187._24_4_ = local_600 * fVar128;
      auVar187._28_4_ = 0;
      auVar27._4_4_ = fStack_63c * fVar123;
      auVar27._0_4_ = local_640 * fVar152;
      auVar27._8_4_ = local_640 * fVar124;
      auVar27._12_4_ = fStack_63c * fVar125;
      auVar27._16_4_ = local_640 * fVar126;
      auVar27._20_4_ = fStack_63c * fVar127;
      auVar27._24_4_ = local_640 * fVar128;
      auVar27._28_4_ = auVar105._4_4_;
      auVar28._4_4_ = fVar123 * fVar218;
      auVar28._0_4_ = fVar152 * fVar217;
      auVar28._8_4_ = fVar124 * fVar217;
      auVar28._12_4_ = fVar125 * fVar218;
      auVar28._16_4_ = fVar126 * fVar217;
      auVar28._20_4_ = fVar127 * fVar218;
      auVar28._24_4_ = fVar128 * fVar217;
      auVar28._28_4_ = *(undefined4 *)(catmullrom_basis1 + lVar97 + 0xda8);
      auVar105 = vfmadd231ps_fma(auVar187,auVar122,local_5c0);
      auVar177 = vfmadd231ps_fma(auVar27,auVar122,local_720);
      auVar104 = vfmadd231ps_fma(auVar28,auVar229,auVar122);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar10,local_660);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar10,local_4c0);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar208,auVar10);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar113,local_7a0);
      auVar89._8_8_ = local_4a0;
      auVar89._0_8_ = local_4a0;
      auVar89._16_8_ = local_4a0;
      auVar89._24_8_ = local_4a0;
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar113,auVar89);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar113,auVar172);
      fVar152 = *(float *)(catmullrom_basis1 + lVar97 + 0x1f9c);
      fVar123 = *(float *)(catmullrom_basis1 + lVar97 + 0x1fa0);
      fVar124 = *(float *)(catmullrom_basis1 + lVar97 + 0x1fa4);
      fVar125 = *(float *)(catmullrom_basis1 + lVar97 + 0x1fa8);
      fVar126 = *(float *)(catmullrom_basis1 + lVar97 + 0x1fac);
      fVar127 = *(float *)(catmullrom_basis1 + lVar97 + 0x1fb0);
      fVar128 = *(float *)(catmullrom_basis1 + lVar97 + 0x1fb4);
      auVar10._4_4_ = local_600 * fVar123;
      auVar10._0_4_ = local_600 * fVar152;
      auVar10._8_4_ = local_600 * fVar124;
      auVar10._12_4_ = local_600 * fVar125;
      auVar10._16_4_ = local_600 * fVar126;
      auVar10._20_4_ = local_600 * fVar127;
      auVar10._24_4_ = local_600 * fVar128;
      auVar10._28_4_ = local_600;
      auVar122._4_4_ = fStack_63c * fVar123;
      auVar122._0_4_ = local_640 * fVar152;
      auVar122._8_4_ = local_640 * fVar124;
      auVar122._12_4_ = fStack_63c * fVar125;
      auVar122._16_4_ = local_640 * fVar126;
      auVar122._20_4_ = fStack_63c * fVar127;
      auVar122._24_4_ = local_640 * fVar128;
      auVar122._28_4_ = fStack_63c;
      auVar29._4_4_ = fVar218 * fVar123;
      auVar29._0_4_ = fVar217 * fVar152;
      auVar29._8_4_ = fVar217 * fVar124;
      auVar29._12_4_ = fVar218 * fVar125;
      auVar29._16_4_ = fVar217 * fVar126;
      auVar29._20_4_ = fVar218 * fVar127;
      auVar29._24_4_ = fVar217 * fVar128;
      auVar29._28_4_ = fVar218;
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar97 + 0x1b18);
      auVar129 = vfmadd231ps_fma(auVar10,auVar113,local_5c0);
      auVar186 = vfmadd231ps_fma(auVar122,auVar113,local_720);
      auVar191 = vfmadd231ps_fma(auVar29,auVar229,auVar113);
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar97 + 0x1694);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar113,local_660);
      auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar113,local_4c0);
      auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar113,auVar208);
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar97 + 0x1210);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar113,local_7a0);
      auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar113,auVar89);
      auVar138._8_4_ = 0x7fffffff;
      auVar138._0_8_ = 0x7fffffff7fffffff;
      auVar138._12_4_ = 0x7fffffff;
      auVar138._16_4_ = 0x7fffffff;
      auVar138._20_4_ = 0x7fffffff;
      auVar138._24_4_ = 0x7fffffff;
      auVar138._28_4_ = 0x7fffffff;
      auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar172,auVar113);
      auVar113 = vandps_avx(ZEXT1632(auVar105),auVar138);
      auVar10 = vandps_avx(ZEXT1632(auVar177),auVar138);
      auVar10 = vmaxps_avx(auVar113,auVar10);
      auVar113 = vandps_avx(ZEXT1632(auVar104),auVar138);
      auVar113 = vmaxps_avx(auVar10,auVar113);
      auVar162._4_4_ = fVar153;
      auVar162._0_4_ = fVar153;
      auVar162._8_4_ = fVar153;
      auVar162._12_4_ = fVar153;
      auVar162._16_4_ = fVar153;
      auVar162._20_4_ = fVar153;
      auVar162._24_4_ = fVar153;
      auVar162._28_4_ = fVar153;
      auVar113 = vcmpps_avx(auVar113,auVar162,1);
      auVar122 = vblendvps_avx(ZEXT1632(auVar105),_local_340,auVar113);
      auVar119 = vblendvps_avx(ZEXT1632(auVar177),_local_2e0,auVar113);
      auVar113 = vandps_avx(ZEXT1632(auVar129),auVar138);
      auVar10 = vandps_avx(ZEXT1632(auVar186),auVar138);
      auVar117 = vmaxps_avx(auVar113,auVar10);
      auVar113 = vandps_avx(ZEXT1632(auVar191),auVar138);
      auVar113 = vmaxps_avx(auVar117,auVar113);
      auVar141 = vcmpps_avx(auVar113,auVar162,1);
      auVar113 = vblendvps_avx(ZEXT1632(auVar129),_local_340,auVar141);
      auVar117 = vblendvps_avx(ZEXT1632(auVar186),_local_2e0,auVar141);
      auVar154 = vfmadd213ps_fma(auVar110,auVar172,ZEXT1632(auVar154));
      auVar105 = vfmadd213ps_fma(auVar122,auVar122,ZEXT832(0) << 0x20);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar119,auVar119);
      auVar110 = vrsqrtps_avx(ZEXT1632(auVar105));
      fVar152 = auVar110._0_4_;
      fVar123 = auVar110._4_4_;
      fVar124 = auVar110._8_4_;
      fVar125 = auVar110._12_4_;
      fVar126 = auVar110._16_4_;
      fVar127 = auVar110._20_4_;
      fVar128 = auVar110._24_4_;
      auVar30._4_4_ = fVar123 * fVar123 * fVar123 * auVar105._4_4_ * -0.5;
      auVar30._0_4_ = fVar152 * fVar152 * fVar152 * auVar105._0_4_ * -0.5;
      auVar30._8_4_ = fVar124 * fVar124 * fVar124 * auVar105._8_4_ * -0.5;
      auVar30._12_4_ = fVar125 * fVar125 * fVar125 * auVar105._12_4_ * -0.5;
      auVar30._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
      auVar30._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
      auVar30._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar30._28_4_ = auVar10._28_4_;
      auVar239._8_4_ = 0x3fc00000;
      auVar239._0_8_ = 0x3fc000003fc00000;
      auVar239._12_4_ = 0x3fc00000;
      auVar239._16_4_ = 0x3fc00000;
      auVar239._20_4_ = 0x3fc00000;
      auVar239._24_4_ = 0x3fc00000;
      auVar239._28_4_ = 0x3fc00000;
      auVar105 = vfmadd231ps_fma(auVar30,auVar239,auVar110);
      fVar152 = auVar105._0_4_;
      fVar123 = auVar105._4_4_;
      auVar31._4_4_ = fVar123 * auVar119._4_4_;
      auVar31._0_4_ = fVar152 * auVar119._0_4_;
      fVar124 = auVar105._8_4_;
      auVar31._8_4_ = fVar124 * auVar119._8_4_;
      fVar125 = auVar105._12_4_;
      auVar31._12_4_ = fVar125 * auVar119._12_4_;
      auVar31._16_4_ = auVar119._16_4_ * 0.0;
      auVar31._20_4_ = auVar119._20_4_ * 0.0;
      auVar31._24_4_ = auVar119._24_4_ * 0.0;
      auVar31._28_4_ = 0;
      auVar32._4_4_ = fVar123 * -auVar122._4_4_;
      auVar32._0_4_ = fVar152 * -auVar122._0_4_;
      auVar32._8_4_ = fVar124 * -auVar122._8_4_;
      auVar32._12_4_ = fVar125 * -auVar122._12_4_;
      auVar32._16_4_ = -auVar122._16_4_ * 0.0;
      auVar32._20_4_ = -auVar122._20_4_ * 0.0;
      auVar32._24_4_ = -auVar122._24_4_ * 0.0;
      auVar32._28_4_ = auVar110._28_4_;
      auVar105 = vfmadd213ps_fma(auVar113,auVar113,ZEXT832(0) << 0x20);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar117,auVar117);
      auVar10 = vrsqrtps_avx(ZEXT1632(auVar105));
      auVar33._28_4_ = auVar141._28_4_;
      auVar33._0_28_ =
           ZEXT1628(CONCAT412(fVar125 * 0.0,
                              CONCAT48(fVar124 * 0.0,CONCAT44(fVar123 * 0.0,fVar152 * 0.0))));
      fVar152 = auVar10._0_4_;
      fVar123 = auVar10._4_4_;
      fVar124 = auVar10._8_4_;
      fVar125 = auVar10._12_4_;
      fVar126 = auVar10._16_4_;
      fVar127 = auVar10._20_4_;
      fVar128 = auVar10._24_4_;
      auVar34._4_4_ = fVar123 * fVar123 * fVar123 * auVar105._4_4_ * -0.5;
      auVar34._0_4_ = fVar152 * fVar152 * fVar152 * auVar105._0_4_ * -0.5;
      auVar34._8_4_ = fVar124 * fVar124 * fVar124 * auVar105._8_4_ * -0.5;
      auVar34._12_4_ = fVar125 * fVar125 * fVar125 * auVar105._12_4_ * -0.5;
      auVar34._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
      auVar34._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
      auVar34._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar34._28_4_ = 0;
      auVar105 = vfmadd231ps_fma(auVar34,auVar239,auVar10);
      fVar152 = auVar105._0_4_;
      auVar225._0_4_ = auVar117._0_4_ * fVar152;
      fVar123 = auVar105._4_4_;
      auVar225._4_4_ = auVar117._4_4_ * fVar123;
      fVar124 = auVar105._8_4_;
      auVar225._8_4_ = auVar117._8_4_ * fVar124;
      fVar125 = auVar105._12_4_;
      auVar225._12_4_ = auVar117._12_4_ * fVar125;
      auVar225._16_4_ = auVar117._16_4_ * 0.0;
      auVar225._20_4_ = auVar117._20_4_ * 0.0;
      auVar225._24_4_ = auVar117._24_4_ * 0.0;
      auVar225._28_4_ = 0;
      auVar35._4_4_ = -auVar113._4_4_ * fVar123;
      auVar35._0_4_ = -auVar113._0_4_ * fVar152;
      auVar35._8_4_ = -auVar113._8_4_ * fVar124;
      auVar35._12_4_ = -auVar113._12_4_ * fVar125;
      auVar35._16_4_ = -auVar113._16_4_ * 0.0;
      auVar35._20_4_ = -auVar113._20_4_ * 0.0;
      auVar35._24_4_ = -auVar113._24_4_ * 0.0;
      auVar35._28_4_ = auVar117._28_4_;
      auVar36._28_4_ = auVar10._28_4_;
      auVar36._0_28_ =
           ZEXT1628(CONCAT412(fVar125 * 0.0,
                              CONCAT48(fVar124 * 0.0,CONCAT44(fVar123 * 0.0,fVar152 * 0.0))));
      auVar105 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar131),auVar196);
      auVar113 = ZEXT1632(auVar131);
      auVar177 = vfmadd213ps_fma(auVar32,auVar113,auVar111);
      auVar104 = vfmadd213ps_fma(auVar33,auVar113,ZEXT1632(auVar154));
      auVar192 = vfnmadd213ps_fma(auVar31,auVar113,auVar196);
      auVar129 = vfmadd213ps_fma(auVar225,ZEXT1632(auVar166),auVar136);
      auVar193 = vfnmadd213ps_fma(auVar32,auVar113,auVar111);
      auVar113 = ZEXT1632(auVar166);
      auVar186 = vfmadd213ps_fma(auVar35,auVar113,auVar161);
      local_500 = ZEXT1632(auVar131);
      auVar207 = vfnmadd231ps_fma(ZEXT1632(auVar154),local_500,auVar33);
      auVar131 = vfmadd213ps_fma(auVar36,auVar113,local_320);
      auVar202 = vfnmadd213ps_fma(auVar225,auVar113,auVar136);
      auVar203 = vfnmadd213ps_fma(auVar35,auVar113,auVar161);
      auVar211 = vfnmadd231ps_fma(local_320,ZEXT1632(auVar166),auVar36);
      auVar113 = vsubps_avx(ZEXT1632(auVar186),ZEXT1632(auVar193));
      auVar10 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar207));
      auVar111._4_4_ = auVar207._4_4_ * auVar113._4_4_;
      auVar111._0_4_ = auVar207._0_4_ * auVar113._0_4_;
      auVar111._8_4_ = auVar207._8_4_ * auVar113._8_4_;
      auVar111._12_4_ = auVar207._12_4_ * auVar113._12_4_;
      auVar111._16_4_ = auVar113._16_4_ * 0.0;
      auVar111._20_4_ = auVar113._20_4_ * 0.0;
      auVar111._24_4_ = auVar113._24_4_ * 0.0;
      auVar111._28_4_ = 0;
      auVar191 = vfmsub231ps_fma(auVar111,ZEXT1632(auVar193),auVar10);
      auVar136._4_4_ = auVar10._4_4_ * auVar192._4_4_;
      auVar136._0_4_ = auVar10._0_4_ * auVar192._0_4_;
      auVar136._8_4_ = auVar10._8_4_ * auVar192._8_4_;
      auVar136._12_4_ = auVar10._12_4_ * auVar192._12_4_;
      auVar136._16_4_ = auVar10._16_4_ * 0.0;
      auVar136._20_4_ = auVar10._20_4_ * 0.0;
      auVar136._24_4_ = auVar10._24_4_ * 0.0;
      auVar136._28_4_ = auVar10._28_4_;
      auVar10 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar192));
      auVar154 = vfmsub231ps_fma(auVar136,ZEXT1632(auVar207),auVar10);
      auVar161._4_4_ = auVar193._4_4_ * auVar10._4_4_;
      auVar161._0_4_ = auVar193._0_4_ * auVar10._0_4_;
      auVar161._8_4_ = auVar193._8_4_ * auVar10._8_4_;
      auVar161._12_4_ = auVar193._12_4_ * auVar10._12_4_;
      auVar161._16_4_ = auVar10._16_4_ * 0.0;
      auVar161._20_4_ = auVar10._20_4_ * 0.0;
      auVar161._24_4_ = auVar10._24_4_ * 0.0;
      auVar161._28_4_ = auVar10._28_4_;
      auVar141 = ZEXT1632(auVar192);
      auVar192 = vfmsub231ps_fma(auVar161,auVar141,auVar113);
      auVar154 = vfmadd231ps_fma(ZEXT1632(auVar192),ZEXT832(0) << 0x20,ZEXT1632(auVar154));
      auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),ZEXT832(0) << 0x20,ZEXT1632(auVar191));
      auVar19 = vcmpps_avx(ZEXT1632(auVar154),ZEXT832(0) << 0x20,2);
      auVar113 = vblendvps_avx(ZEXT1632(auVar202),ZEXT1632(auVar105),auVar19);
      auVar10 = vblendvps_avx(ZEXT1632(auVar203),ZEXT1632(auVar177),auVar19);
      auVar122 = vblendvps_avx(ZEXT1632(auVar211),ZEXT1632(auVar104),auVar19);
      auVar110 = vblendvps_avx(auVar141,ZEXT1632(auVar129),auVar19);
      auVar119 = vblendvps_avx(ZEXT1632(auVar193),ZEXT1632(auVar186),auVar19);
      auVar200 = ZEXT3264(auVar119);
      auVar117 = vblendvps_avx(ZEXT1632(auVar207),ZEXT1632(auVar131),auVar19);
      auVar141 = vblendvps_avx(ZEXT1632(auVar129),auVar141,auVar19);
      auVar21 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar193),auVar19);
      auVar154 = vpackssdw_avx(local_300._0_16_,local_300._16_16_);
      auVar118 = vblendvps_avx(ZEXT1632(auVar131),ZEXT1632(auVar207),auVar19);
      auVar144 = vsubps_avx(auVar141,auVar113);
      auVar146 = vsubps_avx(auVar21,auVar10);
      auVar111 = vsubps_avx(auVar118,auVar122);
      auVar112 = vsubps_avx(auVar113,auVar110);
      auVar136 = vsubps_avx(auVar10,auVar119);
      auVar137 = vsubps_avx(auVar122,auVar117);
      auVar196._4_4_ = auVar111._4_4_ * auVar113._4_4_;
      auVar196._0_4_ = auVar111._0_4_ * auVar113._0_4_;
      auVar196._8_4_ = auVar111._8_4_ * auVar113._8_4_;
      auVar196._12_4_ = auVar111._12_4_ * auVar113._12_4_;
      auVar196._16_4_ = auVar111._16_4_ * auVar113._16_4_;
      auVar196._20_4_ = auVar111._20_4_ * auVar113._20_4_;
      auVar196._24_4_ = auVar111._24_4_ * auVar113._24_4_;
      auVar196._28_4_ = auVar118._28_4_;
      auVar105 = vfmsub231ps_fma(auVar196,auVar122,auVar144);
      auVar37._4_4_ = auVar144._4_4_ * auVar10._4_4_;
      auVar37._0_4_ = auVar144._0_4_ * auVar10._0_4_;
      auVar37._8_4_ = auVar144._8_4_ * auVar10._8_4_;
      auVar37._12_4_ = auVar144._12_4_ * auVar10._12_4_;
      auVar37._16_4_ = auVar144._16_4_ * auVar10._16_4_;
      auVar37._20_4_ = auVar144._20_4_ * auVar10._20_4_;
      auVar37._24_4_ = auVar144._24_4_ * auVar10._24_4_;
      auVar37._28_4_ = auVar141._28_4_;
      auVar131 = vfmsub231ps_fma(auVar37,auVar113,auVar146);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar131),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
      auVar114._0_4_ = auVar146._0_4_ * auVar122._0_4_;
      auVar114._4_4_ = auVar146._4_4_ * auVar122._4_4_;
      auVar114._8_4_ = auVar146._8_4_ * auVar122._8_4_;
      auVar114._12_4_ = auVar146._12_4_ * auVar122._12_4_;
      auVar114._16_4_ = auVar146._16_4_ * auVar122._16_4_;
      auVar114._20_4_ = auVar146._20_4_ * auVar122._20_4_;
      auVar114._24_4_ = auVar146._24_4_ * auVar122._24_4_;
      auVar114._28_4_ = 0;
      auVar131 = vfmsub231ps_fma(auVar114,auVar10,auVar111);
      auVar131 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar131));
      auVar115._0_4_ = auVar137._0_4_ * auVar110._0_4_;
      auVar115._4_4_ = auVar137._4_4_ * auVar110._4_4_;
      auVar115._8_4_ = auVar137._8_4_ * auVar110._8_4_;
      auVar115._12_4_ = auVar137._12_4_ * auVar110._12_4_;
      auVar115._16_4_ = auVar137._16_4_ * auVar110._16_4_;
      auVar115._20_4_ = auVar137._20_4_ * auVar110._20_4_;
      auVar115._24_4_ = auVar137._24_4_ * auVar110._24_4_;
      auVar115._28_4_ = 0;
      auVar105 = vfmsub231ps_fma(auVar115,auVar112,auVar117);
      auVar38._4_4_ = auVar136._4_4_ * auVar117._4_4_;
      auVar38._0_4_ = auVar136._0_4_ * auVar117._0_4_;
      auVar38._8_4_ = auVar136._8_4_ * auVar117._8_4_;
      auVar38._12_4_ = auVar136._12_4_ * auVar117._12_4_;
      auVar38._16_4_ = auVar136._16_4_ * auVar117._16_4_;
      auVar38._20_4_ = auVar136._20_4_ * auVar117._20_4_;
      auVar38._24_4_ = auVar136._24_4_ * auVar117._24_4_;
      auVar38._28_4_ = auVar117._28_4_;
      auVar177 = vfmsub231ps_fma(auVar38,auVar119,auVar137);
      auVar39._4_4_ = auVar112._4_4_ * auVar119._4_4_;
      auVar39._0_4_ = auVar112._0_4_ * auVar119._0_4_;
      auVar39._8_4_ = auVar112._8_4_ * auVar119._8_4_;
      auVar39._12_4_ = auVar112._12_4_ * auVar119._12_4_;
      auVar39._16_4_ = auVar112._16_4_ * auVar119._16_4_;
      auVar39._20_4_ = auVar112._20_4_ * auVar119._20_4_;
      auVar39._24_4_ = auVar112._24_4_ * auVar119._24_4_;
      auVar39._28_4_ = auVar21._28_4_;
      auVar104 = vfmsub231ps_fma(auVar39,auVar136,auVar110);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar177));
      auVar110 = vmaxps_avx(ZEXT1632(auVar131),ZEXT1632(auVar177));
      auVar110 = vcmpps_avx(auVar110,ZEXT832(0) << 0x20,2);
      auVar105 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
      auVar154 = vpand_avx(auVar105,auVar154);
      auVar110 = vpmovsxwd_avx2(auVar154);
      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0x7f,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0xbf,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar110[0x1f]) {
LAB_0117974f:
        auVar184._8_8_ = uStack_558;
        auVar184._0_8_ = local_560;
        auVar184._16_8_ = uStack_550;
        auVar184._24_8_ = uStack_548;
        auVar216 = ZEXT3264(CONCAT428(fStack_63c,
                                      CONCAT424(local_640,
                                                CONCAT420(fStack_63c,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(fStack_63c,
                                                                              CONCAT48(local_640,
                                                                                       uVar103))))))
                           );
      }
      else {
        auVar40._4_4_ = auVar146._4_4_ * auVar137._4_4_;
        auVar40._0_4_ = auVar146._0_4_ * auVar137._0_4_;
        auVar40._8_4_ = auVar146._8_4_ * auVar137._8_4_;
        auVar40._12_4_ = auVar146._12_4_ * auVar137._12_4_;
        auVar40._16_4_ = auVar146._16_4_ * auVar137._16_4_;
        auVar40._20_4_ = auVar146._20_4_ * auVar137._20_4_;
        auVar40._24_4_ = auVar146._24_4_ * auVar137._24_4_;
        auVar40._28_4_ = auVar110._28_4_;
        auVar186 = vfmsub231ps_fma(auVar40,auVar136,auVar111);
        auVar139._0_4_ = auVar111._0_4_ * auVar112._0_4_;
        auVar139._4_4_ = auVar111._4_4_ * auVar112._4_4_;
        auVar139._8_4_ = auVar111._8_4_ * auVar112._8_4_;
        auVar139._12_4_ = auVar111._12_4_ * auVar112._12_4_;
        auVar139._16_4_ = auVar111._16_4_ * auVar112._16_4_;
        auVar139._20_4_ = auVar111._20_4_ * auVar112._20_4_;
        auVar139._24_4_ = auVar111._24_4_ * auVar112._24_4_;
        auVar139._28_4_ = 0;
        auVar129 = vfmsub231ps_fma(auVar139,auVar144,auVar137);
        auVar41._4_4_ = auVar144._4_4_ * auVar136._4_4_;
        auVar41._0_4_ = auVar144._0_4_ * auVar136._0_4_;
        auVar41._8_4_ = auVar144._8_4_ * auVar136._8_4_;
        auVar41._12_4_ = auVar144._12_4_ * auVar136._12_4_;
        auVar41._16_4_ = auVar144._16_4_ * auVar136._16_4_;
        auVar41._20_4_ = auVar144._20_4_ * auVar136._20_4_;
        auVar41._24_4_ = auVar144._24_4_ * auVar136._24_4_;
        auVar41._28_4_ = auVar119._28_4_;
        auVar191 = vfmsub231ps_fma(auVar41,auVar112,auVar146);
        auVar105 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar129),ZEXT1632(auVar191));
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar186),_DAT_01f7b000);
        auVar110 = vrcpps_avx(ZEXT1632(auVar104));
        auVar226._8_4_ = 0x3f800000;
        auVar226._0_8_ = 0x3f8000003f800000;
        auVar226._12_4_ = 0x3f800000;
        auVar226._16_4_ = 0x3f800000;
        auVar226._20_4_ = 0x3f800000;
        auVar226._24_4_ = 0x3f800000;
        auVar226._28_4_ = 0x3f800000;
        auVar105 = vfnmadd213ps_fma(auVar110,ZEXT1632(auVar104),auVar226);
        auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar110,auVar110);
        auVar198._0_4_ = auVar191._0_4_ * auVar122._0_4_;
        auVar198._4_4_ = auVar191._4_4_ * auVar122._4_4_;
        auVar198._8_4_ = auVar191._8_4_ * auVar122._8_4_;
        auVar198._12_4_ = auVar191._12_4_ * auVar122._12_4_;
        auVar198._16_4_ = auVar122._16_4_ * 0.0;
        auVar198._20_4_ = auVar122._20_4_ * 0.0;
        auVar198._24_4_ = auVar122._24_4_ * 0.0;
        auVar198._28_4_ = 0;
        auVar129 = vfmadd231ps_fma(auVar198,auVar10,ZEXT1632(auVar129));
        auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),ZEXT1632(auVar186),auVar113);
        fVar152 = auVar105._0_4_;
        fVar123 = auVar105._4_4_;
        fVar124 = auVar105._8_4_;
        fVar125 = auVar105._12_4_;
        auVar119 = ZEXT1632(CONCAT412(fVar125 * auVar129._12_4_,
                                      CONCAT48(fVar124 * auVar129._8_4_,
                                               CONCAT44(fVar123 * auVar129._4_4_,
                                                        fVar152 * auVar129._0_4_))));
        auVar200 = ZEXT3264(auVar119);
        auVar116._4_4_ = uVar99;
        auVar116._0_4_ = uVar99;
        auVar116._8_4_ = uVar99;
        auVar116._12_4_ = uVar99;
        auVar116._16_4_ = uVar99;
        auVar116._20_4_ = uVar99;
        auVar116._24_4_ = uVar99;
        auVar116._28_4_ = uVar99;
        uVar227 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar140._4_4_ = uVar227;
        auVar140._0_4_ = uVar227;
        auVar140._8_4_ = uVar227;
        auVar140._12_4_ = uVar227;
        auVar140._16_4_ = uVar227;
        auVar140._20_4_ = uVar227;
        auVar140._24_4_ = uVar227;
        auVar140._28_4_ = uVar227;
        auVar10 = vcmpps_avx(auVar116,auVar119,2);
        auVar110 = vcmpps_avx(auVar119,auVar140,2);
        auVar10 = vandps_avx(auVar110,auVar10);
        auVar105 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
        auVar154 = vpand_avx(auVar154,auVar105);
        auVar10 = vpmovsxwd_avx2(auVar154);
        if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0x7f,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar10 >> 0xbf,0) == '\0') &&
            (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar10[0x1f]) goto LAB_0117974f;
        auVar10 = vcmpps_avx(ZEXT1632(auVar104),ZEXT832(0) << 0x20,4);
        auVar105 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
        auVar154 = vpand_avx(auVar154,auVar105);
        auVar10 = vpmovsxwd_avx2(auVar154);
        auVar184._8_8_ = uStack_558;
        auVar184._0_8_ = local_560;
        auVar184._16_8_ = uStack_550;
        auVar184._24_8_ = uStack_548;
        auVar216 = ZEXT3264(CONCAT428(fStack_63c,
                                      CONCAT424(local_640,
                                                CONCAT420(fStack_63c,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(fStack_63c,
                                                                              CONCAT48(local_640,
                                                                                       uVar103))))))
                           );
        if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0x7f,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0xbf,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar10[0x1f] < '\0') {
          auVar117 = ZEXT1632(CONCAT412(fVar125 * auVar131._12_4_,
                                        CONCAT48(fVar124 * auVar131._8_4_,
                                                 CONCAT44(fVar123 * auVar131._4_4_,
                                                          fVar152 * auVar131._0_4_))));
          auVar141 = ZEXT1632(CONCAT412(fVar125 * auVar177._12_4_,
                                        CONCAT48(fVar124 * auVar177._8_4_,
                                                 CONCAT44(fVar123 * auVar177._4_4_,
                                                          fVar152 * auVar177._0_4_))));
          auVar183._8_4_ = 0x3f800000;
          auVar183._0_8_ = 0x3f8000003f800000;
          auVar183._12_4_ = 0x3f800000;
          auVar183._16_4_ = 0x3f800000;
          auVar183._20_4_ = 0x3f800000;
          auVar183._24_4_ = 0x3f800000;
          auVar183._28_4_ = 0x3f800000;
          auVar110 = vsubps_avx(auVar183,auVar117);
          _local_140 = vblendvps_avx(auVar110,auVar117,auVar19);
          auVar110 = vsubps_avx(auVar183,auVar141);
          local_360 = vblendvps_avx(auVar110,auVar141,auVar19);
          auVar184 = auVar10;
          local_540 = auVar119;
        }
      }
      auVar241 = ZEXT3264(local_7a0);
      auVar176 = ZEXT3264(auVar229);
      auVar151 = ZEXT3264(auVar172);
      if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar184 >> 0x7f,0) == '\0') &&
            (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar184 >> 0xbf,0) == '\0') &&
          (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar184[0x1f]) {
        auVar151 = ZEXT3264(local_6a0);
        auVar176 = ZEXT3264(local_5c0);
        auVar165 = ZEXT3264(local_660);
        auVar206 = ZEXT3264(local_720);
      }
      else {
        auVar10 = vsubps_avx(ZEXT1632(auVar166),local_500);
        auVar154 = vfmadd213ps_fma(auVar10,_local_140,local_500);
        fVar152 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar42._4_4_ = (auVar154._4_4_ + auVar154._4_4_) * fVar152;
        auVar42._0_4_ = (auVar154._0_4_ + auVar154._0_4_) * fVar152;
        auVar42._8_4_ = (auVar154._8_4_ + auVar154._8_4_) * fVar152;
        auVar42._12_4_ = (auVar154._12_4_ + auVar154._12_4_) * fVar152;
        auVar42._16_4_ = fVar152 * 0.0;
        auVar42._20_4_ = fVar152 * 0.0;
        auVar42._24_4_ = fVar152 * 0.0;
        auVar42._28_4_ = 0;
        auVar200 = ZEXT3264(local_540);
        auVar10 = vcmpps_avx(local_540,auVar42,6);
        auVar110 = auVar184 & auVar10;
        auVar165 = ZEXT3264(local_660);
        auVar185 = ZEXT3264(auVar208);
        auVar206 = ZEXT3264(local_720);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) {
          auVar151 = ZEXT3264(local_6a0);
          auVar176 = ZEXT3264(local_5c0);
        }
        else {
          auVar142._8_4_ = 0xbf800000;
          auVar142._0_8_ = 0xbf800000bf800000;
          auVar142._12_4_ = 0xbf800000;
          auVar142._16_4_ = 0xbf800000;
          auVar142._20_4_ = 0xbf800000;
          auVar142._24_4_ = 0xbf800000;
          auVar142._28_4_ = 0xbf800000;
          auVar163._8_4_ = 0x40000000;
          auVar163._0_8_ = 0x4000000040000000;
          auVar163._12_4_ = 0x40000000;
          auVar163._16_4_ = 0x40000000;
          auVar163._20_4_ = 0x40000000;
          auVar163._24_4_ = 0x40000000;
          auVar163._28_4_ = 0x40000000;
          auVar154 = vfmadd213ps_fma(local_360,auVar163,auVar142);
          local_280 = _local_140;
          local_360 = ZEXT1632(auVar154);
          auVar110 = local_360;
          local_260 = ZEXT1632(auVar154);
          local_240 = local_540;
          local_220 = 0;
          local_21c = iVar15;
          local_210 = uVar79;
          uStack_208 = uVar80;
          local_200 = uVar81;
          uStack_1f8 = uVar82;
          local_1f0 = uVar83;
          uStack_1e8 = uVar84;
          local_1e0 = uVar85;
          uStack_1d8 = uVar86;
          local_360 = auVar110;
          if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_5a0 = vandps_avx(auVar10,auVar184);
            fVar152 = 1.0 / (float)local_460._0_4_;
            local_1a0[0] = fVar152 * ((float)local_140._0_4_ + 0.0);
            local_1a0[1] = fVar152 * ((float)local_140._4_4_ + 1.0);
            local_1a0[2] = fVar152 * (fStack_138 + 2.0);
            local_1a0[3] = fVar152 * (fStack_134 + 3.0);
            fStack_190 = fVar152 * (fStack_130 + 4.0);
            fStack_18c = fVar152 * (fStack_12c + 5.0);
            fStack_188 = fVar152 * (fStack_128 + 6.0);
            fStack_184 = fStack_124 + 7.0;
            local_360._0_8_ = auVar154._0_8_;
            local_360._8_8_ = auVar154._8_8_;
            local_180 = local_360._0_8_;
            uStack_178 = local_360._8_8_;
            uStack_170 = 0;
            uStack_168 = 0;
            local_160 = local_540;
            auVar143._8_4_ = 0x7f800000;
            auVar143._0_8_ = 0x7f8000007f800000;
            auVar143._12_4_ = 0x7f800000;
            auVar143._16_4_ = 0x7f800000;
            auVar143._20_4_ = 0x7f800000;
            auVar143._24_4_ = 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar10 = vblendvps_avx(auVar143,local_540,local_5a0);
            auVar110 = vshufps_avx(auVar10,auVar10,0xb1);
            auVar110 = vminps_avx(auVar10,auVar110);
            auVar119 = vshufpd_avx(auVar110,auVar110,5);
            auVar110 = vminps_avx(auVar110,auVar119);
            auVar119 = vpermpd_avx2(auVar110,0x4e);
            auVar110 = vminps_avx(auVar110,auVar119);
            auVar110 = vcmpps_avx(auVar10,auVar110,0);
            auVar119 = local_5a0 & auVar110;
            auVar10 = local_5a0;
            if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar119 >> 0x7f,0) != '\0') ||
                  (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0xbf,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar119[0x1f] < '\0') {
              auVar10 = vandps_avx(auVar110,local_5a0);
            }
            uVar93 = vmovmskps_avx(auVar10);
            uVar95 = 0;
            for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
              uVar95 = uVar95 + 1;
            }
            uVar96 = (ulong)uVar95;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar152 = local_1a0[uVar96];
              fVar123 = 1.0 - fVar152;
              auVar109 = ZEXT416((uint)fVar152);
              auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,ZEXT416(0xc0a00000))
              ;
              auVar171 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * 3.0)),
                                         ZEXT416((uint)(fVar152 + fVar152)),auVar20);
              auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,ZEXT416(0x40000000))
              ;
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar123 * fVar123 * -3.0)),
                                        ZEXT416((uint)(fVar123 + fVar123)),auVar20);
              auVar154 = vfnmadd231ss_fma(ZEXT416((uint)(fVar152 * (fVar123 + fVar123))),
                                          ZEXT416((uint)fVar123),ZEXT416((uint)fVar123));
              auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152)),auVar109,
                                         ZEXT416((uint)(fVar123 * -2.0)));
              auVar200 = ZEXT464(0x3f000000);
              fVar123 = auVar20._0_4_ * 0.5;
              fVar124 = auVar109._0_4_ * 0.5;
              auVar167._0_4_ = fVar124 * local_840;
              auVar167._4_4_ = fVar124 * fStack_83c;
              auVar167._8_4_ = fVar124 * fStack_838;
              auVar167._12_4_ = fVar124 * fStack_834;
              auVar132._4_4_ = fVar123;
              auVar132._0_4_ = fVar123;
              auVar132._8_4_ = fVar123;
              auVar132._12_4_ = fVar123;
              auVar20 = vfmadd132ps_fma(auVar132,auVar167,*pauVar3);
              fVar123 = auVar171._0_4_ * 0.5;
              auVar168._4_4_ = fVar123;
              auVar168._0_4_ = fVar123;
              auVar168._8_4_ = fVar123;
              auVar168._12_4_ = fVar123;
              auVar20 = vfmadd132ps_fma(auVar168,auVar20,*pauVar2);
              uVar227 = *(undefined4 *)((long)&local_180 + uVar96 * 4);
              fVar123 = auVar154._0_4_ * 0.5;
              auVar155._4_4_ = fVar123;
              auVar155._0_4_ = fVar123;
              auVar155._8_4_ = fVar123;
              auVar155._12_4_ = fVar123;
              auVar20 = vfmadd132ps_fma(auVar155,auVar20,*pauVar1);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar96 * 4);
              *(int *)(ray + k * 4 + 0xc0) = auVar20._0_4_;
              uVar16 = vextractps_avx(auVar20,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
              uVar16 = vextractps_avx(auVar20,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
              *(float *)(ray + k * 4 + 0xf0) = fVar152;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar227;
              *(uint *)(ray + k * 4 + 0x110) = uVar14;
              *(uint *)(ray + k * 4 + 0x120) = uVar94;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_700._4_4_ = uVar94;
              local_700._0_4_ = uVar94;
              local_700._8_4_ = uVar94;
              auStack_6f0 = auVar122._16_16_;
              uStack_6f4 = uVar94;
              local_5e0._0_8_ = CONCAT44(uVar14,uVar14);
              local_5e0 = ZEXT1632(CONCAT412(uVar14,CONCAT48(uVar14,local_5e0._0_8_)));
              local_4e0 = ZEXT1632(*local_6d8);
              auStack_7f0 = auVar113._16_16_;
              local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              local_740 = auVar172;
              local_6d0 = context;
              local_6c8 = k;
              local_6c0 = auVar208;
              _local_680 = auVar229;
              local_620 = uVar102;
              uStack_618 = uVar102;
              uStack_610 = uVar102;
              uStack_608 = uVar102;
              auVar113 = local_720;
              while( true ) {
                auVar10 = _local_800;
                fVar152 = local_1a0[uVar96];
                local_400._4_4_ = fVar152;
                local_400._0_4_ = fVar152;
                local_400._8_4_ = fVar152;
                local_400._12_4_ = fVar152;
                local_3f0 = *(undefined4 *)((long)&local_180 + uVar96 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar96 * 4);
                fVar123 = 1.0 - fVar152;
                auVar154 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_400,
                                           ZEXT416(0xc0a00000));
                auVar131 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * 3.0)),
                                           ZEXT416((uint)(fVar152 + fVar152)),auVar154);
                auVar200 = ZEXT1664(auVar131);
                auVar154 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_400,
                                           ZEXT416(0x40000000));
                auVar154 = vfmadd231ss_fma(ZEXT416((uint)(fVar123 * fVar123 * -3.0)),
                                           ZEXT416((uint)(fVar123 + fVar123)),auVar154);
                auVar166 = vfnmadd231ss_fma(ZEXT416((uint)(fVar152 * (fVar123 + fVar123))),
                                            ZEXT416((uint)fVar123),ZEXT416((uint)fVar123));
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152)),local_400,
                                           ZEXT416((uint)(fVar123 * -2.0)));
                fVar152 = auVar154._0_4_ * 0.5;
                fVar123 = auVar105._0_4_ * 0.5;
                auVar181._0_4_ = fVar123 * local_840;
                auVar181._4_4_ = fVar123 * fStack_83c;
                auVar181._8_4_ = fVar123 * fStack_838;
                auVar181._12_4_ = fVar123 * fStack_834;
                auVar159._4_4_ = fVar152;
                auVar159._0_4_ = fVar152;
                auVar159._8_4_ = fVar152;
                auVar159._12_4_ = fVar152;
                auVar154 = vfmadd132ps_fma(auVar159,auVar181,auVar20);
                fVar152 = auVar131._0_4_ * 0.5;
                auVar182._4_4_ = fVar152;
                auVar182._0_4_ = fVar152;
                auVar182._8_4_ = fVar152;
                auVar182._12_4_ = fVar152;
                auVar154 = vfmadd132ps_fma(auVar182,auVar154,auVar171);
                local_770.context = context->user;
                fVar152 = auVar166._0_4_ * 0.5;
                auVar160._4_4_ = fVar152;
                auVar160._0_4_ = fVar152;
                auVar160._8_4_ = fVar152;
                auVar160._12_4_ = fVar152;
                auVar105 = vfmadd132ps_fma(auVar160,auVar154,auVar109);
                local_430 = auVar105._0_4_;
                uStack_42c = local_430;
                uStack_428 = local_430;
                uStack_424 = local_430;
                auVar154 = vshufps_avx(auVar105,auVar105,0x55);
                local_420 = auVar154;
                local_410 = vshufps_avx(auVar105,auVar105,0xaa);
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                local_3e0 = local_5e0._0_8_;
                uStack_3d8 = local_5e0._8_8_;
                local_3d0 = _local_700;
                vpcmpeqd_avx2(ZEXT1632(_local_700),ZEXT1632(_local_700));
                uStack_3bc = (local_770.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_770.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_7c0 = local_4e0._0_16_;
                local_770.valid = (int *)local_7c0;
                local_770.geometryUserPtr = pGVar17->userPtr;
                local_770.hit = (RTCHitN *)&local_430;
                local_770.N = 4;
                local_770.ray = (RTCRayN *)ray;
                if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar200 = ZEXT1664(auVar131);
                  (*pGVar17->intersectionFilterN)(&local_770);
                  auVar176 = ZEXT3264(_local_680);
                  auVar185 = ZEXT3264(local_6c0);
                  auVar151 = ZEXT3264(local_740);
                  auVar241 = ZEXT3264(local_7a0);
                  auVar216 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  pre = local_7b0;
                  context = local_6d0;
                  k = local_6c8;
                  auVar113 = local_720;
                  uVar102 = local_620;
                  uVar232 = uStack_618;
                  uVar233 = uStack_610;
                  uVar234 = uStack_608;
                }
                auVar206 = ZEXT3264(auVar113);
                if (local_7c0 == (undefined1  [16])0x0) {
                  auVar154 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar105 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                  auVar154 = auVar154 ^ auVar105;
                }
                else {
                  p_Var18 = context->args->filter;
                  auVar105 = vpcmpeqd_avx(auVar154,auVar154);
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar17->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar200 = ZEXT1664(auVar200._0_16_);
                    (*p_Var18)(&local_770);
                    auVar176 = ZEXT3264(_local_680);
                    auVar185 = ZEXT3264(local_6c0);
                    auVar151 = ZEXT3264(local_740);
                    auVar241 = ZEXT3264(local_7a0);
                    auVar216 = ZEXT3264(CONCAT428(fStack_624,
                                                  CONCAT424(fStack_628,
                                                            CONCAT420(fStack_62c,
                                                                      CONCAT416(fStack_630,
                                                                                CONCAT412(fStack_634
                                                                                          ,CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                    auVar206 = ZEXT3264(local_720);
                    auVar105 = vpcmpeqd_avx(auVar105,auVar105);
                    pre = local_7b0;
                    context = local_6d0;
                    k = local_6c8;
                    uVar102 = local_620;
                    uVar232 = uStack_618;
                    uVar233 = uStack_610;
                    uVar234 = uStack_608;
                  }
                  auVar131 = vpcmpeqd_avx(local_7c0,_DAT_01f45a50);
                  auVar154 = auVar131 ^ auVar105;
                  if (local_7c0 != (undefined1  [16])0x0) {
                    auVar131 = auVar131 ^ auVar105;
                    auVar105 = vmaskmovps_avx(auVar131,*(undefined1 (*) [16])local_770.hit);
                    *(undefined1 (*) [16])(local_770.ray + 0xc0) = auVar105;
                    auVar105 = vmaskmovps_avx(auVar131,*(undefined1 (*) [16])(local_770.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0xd0) = auVar105;
                    auVar105 = vmaskmovps_avx(auVar131,*(undefined1 (*) [16])(local_770.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0xe0) = auVar105;
                    auVar105 = vmaskmovps_avx(auVar131,*(undefined1 (*) [16])(local_770.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0xf0) = auVar105;
                    auVar105 = vmaskmovps_avx(auVar131,*(undefined1 (*) [16])(local_770.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x100) = auVar105;
                    auVar105 = vmaskmovps_avx(auVar131,*(undefined1 (*) [16])(local_770.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x110) = auVar105;
                    auVar105 = vmaskmovps_avx(auVar131,*(undefined1 (*) [16])(local_770.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x120) = auVar105;
                    auVar105 = vmaskmovps_avx(auVar131,*(undefined1 (*) [16])(local_770.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x130) = auVar105;
                    auVar105 = vmaskmovps_avx(auVar131,*(undefined1 (*) [16])(local_770.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x140) = auVar105;
                  }
                }
                auVar113 = local_540;
                auVar172 = auVar151._0_32_;
                auVar229 = auVar176._0_32_;
                auVar208 = auVar185._0_32_;
                auVar135._8_8_ = 0x100000001;
                auVar135._0_8_ = 0x100000001;
                if ((auVar135 & auVar154) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_800._0_4_;
                }
                else {
                  local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_800._4_4_ = 0;
                  local_800._8_4_ = 0;
                  local_800._12_4_ = 0;
                }
                *(undefined4 *)(local_5a0 + uVar96 * 4) = 0;
                auStack_7f0 = auVar10._16_16_;
                auVar121._4_4_ = local_800._0_4_;
                auVar121._0_4_ = local_800._0_4_;
                auVar121._8_4_ = local_800._0_4_;
                auVar121._12_4_ = local_800._0_4_;
                auVar121._16_4_ = local_800._0_4_;
                auVar121._20_4_ = local_800._0_4_;
                auVar121._24_4_ = local_800._0_4_;
                auVar121._28_4_ = local_800._0_4_;
                auVar122 = vcmpps_avx(auVar113,auVar121,2);
                auVar10 = vandps_avx(auVar122,local_5a0);
                local_5a0 = local_5a0 & auVar122;
                if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_5a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_5a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_5a0 >> 0x7f,0) == '\0') &&
                      (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_5a0 >> 0xbf,0) == '\0') &&
                    (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_5a0[0x1f]) break;
                auVar150._8_4_ = 0x7f800000;
                auVar150._0_8_ = 0x7f8000007f800000;
                auVar150._12_4_ = 0x7f800000;
                auVar150._16_4_ = 0x7f800000;
                auVar150._20_4_ = 0x7f800000;
                auVar150._24_4_ = 0x7f800000;
                auVar150._28_4_ = 0x7f800000;
                auVar113 = vblendvps_avx(auVar150,auVar113,auVar10);
                auVar122 = vshufps_avx(auVar113,auVar113,0xb1);
                auVar122 = vminps_avx(auVar113,auVar122);
                auVar110 = vshufpd_avx(auVar122,auVar122,5);
                auVar122 = vminps_avx(auVar122,auVar110);
                auVar110 = vpermpd_avx2(auVar122,0x4e);
                auVar122 = vminps_avx(auVar122,auVar110);
                auVar113 = vcmpps_avx(auVar113,auVar122,0);
                auVar110 = auVar10 & auVar113;
                auVar122 = auVar10;
                if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar110 >> 0x7f,0) != '\0') ||
                      (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar110 >> 0xbf,0) != '\0') ||
                    (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar110[0x1f] < '\0') {
                  auVar122 = vandps_avx(auVar113,auVar10);
                }
                auVar113 = auVar206._0_32_;
                uVar95 = vmovmskps_avx(auVar122);
                uVar14 = 0;
                for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
                  uVar14 = uVar14 + 1;
                }
                uVar96 = (ulong)uVar14;
                local_5a0 = auVar10;
              }
            }
          }
          auVar151 = ZEXT3264(local_6a0);
          auVar176 = ZEXT3264(local_5c0);
          auVar165 = ZEXT3264(local_660);
        }
      }
    }
    auVar235 = ZEXT464((uint)fVar153);
    auVar185 = ZEXT3264(CONCAT428(fStack_5e4,
                                  CONCAT424(fStack_5e8,
                                            CONCAT420(fStack_5ec,
                                                      CONCAT416(fStack_5f0,
                                                                CONCAT412(fStack_5f4,
                                                                          CONCAT48(fStack_5f8,
                                                                                   CONCAT44(
                                                  fStack_5fc,local_600))))))));
    local_700._0_8_ = prim;
    if (8 < iVar15) {
      local_300._4_4_ = iVar15;
      local_300._0_4_ = iVar15;
      local_300._8_4_ = iVar15;
      local_300._12_4_ = iVar15;
      local_300._16_4_ = iVar15;
      local_300._20_4_ = iVar15;
      local_300._24_4_ = iVar15;
      local_300._28_4_ = iVar15;
      local_340._4_4_ = fVar153;
      local_340._0_4_ = fVar153;
      fStack_338 = fVar153;
      fStack_334 = fVar153;
      fStack_330 = fVar153;
      fStack_32c = fVar153;
      fStack_328 = fVar153;
      fStack_324 = fVar153;
      local_100 = uVar99;
      uStack_fc = uVar99;
      uStack_f8 = uVar99;
      uStack_f4 = uVar99;
      uStack_f0 = uVar99;
      uStack_ec = uVar99;
      uStack_e8 = uVar99;
      uStack_e4 = uVar99;
      local_120 = 1.0 / (float)local_460._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      local_2b0 = local_480._0_4_;
      uStack_2ac = local_480._0_4_;
      uStack_2a8 = local_480._0_4_;
      uStack_2a4 = local_480._0_4_;
      local_2c0 = local_520._0_4_;
      uStack_2bc = local_520._0_4_;
      uStack_2b8 = local_520._0_4_;
      uStack_2b4 = local_520._0_4_;
      auVar11._8_8_ = uStack_498;
      auVar11._0_8_ = local_4a0;
      auVar11._16_8_ = uStack_490;
      auVar11._24_8_ = uStack_488;
      local_740 = auVar172;
      local_6c0 = auVar208;
      _local_680 = auVar229;
      local_620 = uVar102;
      uStack_618 = uVar232;
      uStack_610 = uVar233;
      uStack_608 = uVar234;
      for (lVar101 = 8; local_6a0 = auVar151._0_32_, lVar101 < iVar15; lVar101 = lVar101 + 8) {
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar101 * 4 + lVar97);
        auVar10 = *(undefined1 (*) [32])(lVar97 + 0x22047f0 + lVar101 * 4);
        auVar122 = *(undefined1 (*) [32])(lVar97 + 0x2204c74 + lVar101 * 4);
        pauVar5 = (undefined1 (*) [32])(lVar97 + 0x22050f8 + lVar101 * 4);
        fVar153 = *(float *)*pauVar5;
        fVar152 = *(float *)(*pauVar5 + 4);
        fVar123 = *(float *)(*pauVar5 + 8);
        fVar124 = *(float *)(*pauVar5 + 0xc);
        fVar125 = *(float *)(*pauVar5 + 0x10);
        fVar126 = *(float *)(*pauVar5 + 0x14);
        fVar127 = *(float *)(*pauVar5 + 0x18);
        auVar92 = *(undefined1 (*) [28])*pauVar5;
        auVar201._0_4_ = fVar153 * auVar185._0_4_;
        auVar201._4_4_ = fVar152 * auVar185._4_4_;
        auVar201._8_4_ = fVar123 * auVar185._8_4_;
        auVar201._12_4_ = fVar124 * auVar185._12_4_;
        auVar201._16_4_ = fVar125 * auVar185._16_4_;
        auVar201._20_4_ = fVar126 * auVar185._20_4_;
        auVar201._28_36_ = auVar200._28_36_;
        auVar201._24_4_ = fVar127 * auVar185._24_4_;
        fVar210 = auVar216._0_4_;
        auVar200._0_4_ = fVar210 * fVar153;
        fVar217 = auVar216._4_4_;
        auVar200._4_4_ = fVar217 * fVar152;
        fVar218 = auVar216._8_4_;
        auVar200._8_4_ = fVar218 * fVar123;
        fVar219 = auVar216._12_4_;
        auVar200._12_4_ = fVar219 * fVar124;
        fVar220 = auVar216._16_4_;
        auVar200._16_4_ = fVar220 * fVar125;
        fVar221 = auVar216._20_4_;
        auVar200._20_4_ = fVar221 * fVar126;
        auVar200._28_36_ = auVar151._28_36_;
        fVar222 = auVar216._24_4_;
        auVar200._24_4_ = fVar222 * fVar127;
        auVar20 = vfmadd231ps_fma(auVar201._0_32_,auVar122,auVar176._0_32_);
        auVar171 = vfmadd231ps_fma(auVar200._0_32_,auVar122,auVar206._0_32_);
        auVar111 = auVar165._0_32_;
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar10,auVar111);
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar10,local_4c0);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar113,auVar241._0_32_);
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar113,auVar11);
        auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar101 * 4 + lVar97);
        auVar119 = *(undefined1 (*) [32])(lVar97 + 0x2206c10 + lVar101 * 4);
        auVar117 = *(undefined1 (*) [32])(lVar97 + 0x2207094 + lVar101 * 4);
        pfVar6 = (float *)(lVar97 + 0x2207518 + lVar101 * 4);
        fVar128 = *pfVar6;
        fVar73 = pfVar6[1];
        fVar74 = pfVar6[2];
        fVar75 = pfVar6[3];
        fVar76 = pfVar6[4];
        fVar77 = pfVar6[5];
        fVar78 = pfVar6[6];
        auVar151._0_4_ = fVar128 * auVar185._0_4_;
        auVar151._4_4_ = fVar73 * auVar185._4_4_;
        auVar151._8_4_ = fVar74 * auVar185._8_4_;
        auVar151._12_4_ = fVar75 * auVar185._12_4_;
        auVar151._16_4_ = fVar76 * auVar185._16_4_;
        auVar151._20_4_ = fVar77 * auVar185._20_4_;
        auVar151._28_36_ = auVar185._28_36_;
        auVar151._24_4_ = fVar78 * auVar185._24_4_;
        auVar185._0_4_ = fVar210 * fVar128;
        auVar185._4_4_ = fVar217 * fVar73;
        auVar185._8_4_ = fVar218 * fVar74;
        auVar185._12_4_ = fVar219 * fVar75;
        auVar185._16_4_ = fVar220 * fVar76;
        auVar185._20_4_ = fVar221 * fVar77;
        auVar185._28_36_ = auVar235._28_36_;
        auVar185._24_4_ = fVar222 * fVar78;
        auVar109 = vfmadd231ps_fma(auVar151._0_32_,auVar117,auVar176._0_32_);
        auVar154 = vfmadd231ps_fma(auVar185._0_32_,auVar117,auVar206._0_32_);
        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar119,auVar111);
        auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar119,local_4c0);
        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar110,auVar241._0_32_);
        auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar110,auVar11);
        local_460 = ZEXT1632(auVar109);
        local_5e0 = ZEXT1632(auVar20);
        local_480 = vsubps_avx(local_460,local_5e0);
        local_4e0 = ZEXT1632(auVar154);
        auVar144 = ZEXT1632(auVar171);
        local_500 = vsubps_avx(local_4e0,auVar144);
        auVar43._4_4_ = auVar171._4_4_ * local_480._4_4_;
        auVar43._0_4_ = auVar171._0_4_ * local_480._0_4_;
        auVar43._8_4_ = auVar171._8_4_ * local_480._8_4_;
        auVar43._12_4_ = auVar171._12_4_ * local_480._12_4_;
        auVar43._16_4_ = local_480._16_4_ * 0.0;
        auVar43._20_4_ = local_480._20_4_ * 0.0;
        auVar43._24_4_ = local_480._24_4_ * 0.0;
        auVar43._28_4_ = local_4c0._28_4_;
        fVar236 = local_500._0_4_;
        auVar145._0_4_ = fVar236 * auVar20._0_4_;
        fVar242 = local_500._4_4_;
        auVar145._4_4_ = fVar242 * auVar20._4_4_;
        fVar243 = local_500._8_4_;
        auVar145._8_4_ = fVar243 * auVar20._8_4_;
        fVar244 = local_500._12_4_;
        auVar145._12_4_ = fVar244 * auVar20._12_4_;
        fVar245 = local_500._16_4_;
        auVar145._16_4_ = fVar245 * 0.0;
        fVar246 = local_500._20_4_;
        auVar145._20_4_ = fVar246 * 0.0;
        fVar247 = local_500._24_4_;
        auVar145._24_4_ = fVar247 * 0.0;
        auVar145._28_4_ = 0;
        auVar21 = vsubps_avx(auVar43,auVar145);
        _local_2e0 = *pauVar5;
        auVar19 = _local_2e0;
        auVar44._4_4_ = local_e0._4_4_ * fVar152;
        auVar44._0_4_ = (float)local_e0 * fVar153;
        auVar44._8_4_ = (float)uStack_d8 * fVar123;
        auVar44._12_4_ = uStack_d8._4_4_ * fVar124;
        auVar44._16_4_ = (float)uStack_d0 * fVar125;
        auVar44._20_4_ = uStack_d0._4_4_ * fVar126;
        auVar44._24_4_ = (float)uStack_c8 * fVar127;
        auVar44._28_4_ = 0;
        auVar20 = vfmadd231ps_fma(auVar44,local_c0,auVar122);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,auVar10);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_80,auVar113);
        auVar45._4_4_ = local_e0._4_4_ * fVar73;
        auVar45._0_4_ = (float)local_e0 * fVar128;
        auVar45._8_4_ = (float)uStack_d8 * fVar74;
        auVar45._12_4_ = uStack_d8._4_4_ * fVar75;
        auVar45._16_4_ = (float)uStack_d0 * fVar76;
        auVar45._20_4_ = uStack_d0._4_4_ * fVar77;
        auVar45._24_4_ = (float)uStack_c8 * fVar78;
        auVar45._28_4_ = uStack_c8._4_4_;
        auVar171 = vfmadd231ps_fma(auVar45,auVar117,local_c0);
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar119,local_a0);
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar110,local_80);
        auVar235 = ZEXT1664(auVar171);
        auVar176._0_4_ = fVar236 * fVar236;
        auVar176._4_4_ = fVar242 * fVar242;
        auVar176._8_4_ = fVar243 * fVar243;
        auVar176._12_4_ = fVar244 * fVar244;
        auVar176._16_4_ = fVar245 * fVar245;
        auVar176._20_4_ = fVar246 * fVar246;
        auVar176._28_36_ = auVar216._28_36_;
        auVar176._24_4_ = fVar247 * fVar247;
        auVar109 = vfmadd231ps_fma(auVar176._0_32_,local_480,local_480);
        auVar200 = ZEXT3264(local_720);
        auVar146 = ZEXT1632(auVar20);
        auVar112 = ZEXT1632(auVar171);
        auVar141 = vmaxps_avx(auVar146,auVar112);
        auVar213._0_4_ = auVar141._0_4_ * auVar141._0_4_ * auVar109._0_4_;
        auVar213._4_4_ = auVar141._4_4_ * auVar141._4_4_ * auVar109._4_4_;
        auVar213._8_4_ = auVar141._8_4_ * auVar141._8_4_ * auVar109._8_4_;
        auVar213._12_4_ = auVar141._12_4_ * auVar141._12_4_ * auVar109._12_4_;
        auVar213._16_4_ = auVar141._16_4_ * auVar141._16_4_ * 0.0;
        auVar213._20_4_ = auVar141._20_4_ * auVar141._20_4_ * 0.0;
        auVar213._24_4_ = auVar141._24_4_ * auVar141._24_4_ * 0.0;
        auVar213._28_4_ = 0;
        auVar46._4_4_ = auVar21._4_4_ * auVar21._4_4_;
        auVar46._0_4_ = auVar21._0_4_ * auVar21._0_4_;
        auVar46._8_4_ = auVar21._8_4_ * auVar21._8_4_;
        auVar46._12_4_ = auVar21._12_4_ * auVar21._12_4_;
        auVar46._16_4_ = auVar21._16_4_ * auVar21._16_4_;
        auVar46._20_4_ = auVar21._20_4_ * auVar21._20_4_;
        auVar46._24_4_ = auVar21._24_4_ * auVar21._24_4_;
        auVar46._28_4_ = auVar21._28_4_;
        auVar141 = vcmpps_avx(auVar46,auVar213,2);
        local_220 = (int)lVar101;
        auVar214._4_4_ = local_220;
        auVar214._0_4_ = local_220;
        auVar214._8_4_ = local_220;
        auVar214._12_4_ = local_220;
        auVar214._16_4_ = local_220;
        auVar214._20_4_ = local_220;
        auVar214._24_4_ = local_220;
        auVar214._28_4_ = local_220;
        auVar21 = vpor_avx2(auVar214,_DAT_01fb4ba0);
        auVar118 = vpcmpgtd_avx2(local_300,auVar21);
        auVar21 = auVar118 & auVar141;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0x7f,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0xbf,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar21[0x1f]) {
          auVar151 = ZEXT3264(local_6a0);
          auVar206 = ZEXT3264(local_720);
          auVar185 = ZEXT3264(CONCAT428(fStack_5e4,
                                        CONCAT424(fStack_5e8,
                                                  CONCAT420(fStack_5ec,
                                                            CONCAT416(fStack_5f0,
                                                                      CONCAT412(fStack_5f4,
                                                                                CONCAT48(fStack_5f8,
                                                                                         CONCAT44(
                                                  fStack_5fc,local_600))))))));
          auVar216 = ZEXT3264(auVar216._0_32_);
          auVar165 = ZEXT3264(auVar111);
          auVar241 = ZEXT3264(local_7a0);
        }
        else {
          local_320 = vandps_avx(auVar118,auVar141);
          auVar47._4_4_ = fVar73 * local_620._4_4_;
          auVar47._0_4_ = fVar128 * (float)local_620;
          auVar47._8_4_ = fVar74 * (float)uStack_618;
          auVar47._12_4_ = fVar75 * uStack_618._4_4_;
          auVar47._16_4_ = fVar76 * (float)uStack_610;
          auVar47._20_4_ = fVar77 * uStack_610._4_4_;
          auVar47._24_4_ = fVar78 * (float)uStack_608;
          auVar47._28_4_ = auVar141._28_4_;
          auVar20 = vfmadd213ps_fma(auVar117,_local_680,auVar47);
          auVar20 = vfmadd213ps_fma(auVar119,local_6c0,ZEXT1632(auVar20));
          auVar20 = vfmadd213ps_fma(auVar110,local_740,ZEXT1632(auVar20));
          local_2e0._0_4_ = auVar92._0_4_;
          local_2e0._4_4_ = auVar92._4_4_;
          fStack_2d8 = auVar92._8_4_;
          fStack_2d4 = auVar92._12_4_;
          fStack_2d0 = auVar92._16_4_;
          fStack_2cc = auVar92._20_4_;
          fStack_2c8 = auVar92._24_4_;
          auVar173._0_4_ = (float)local_620 * (float)local_2e0._0_4_;
          auVar173._4_4_ = local_620._4_4_ * (float)local_2e0._4_4_;
          auVar173._8_4_ = (float)uStack_618 * fStack_2d8;
          auVar173._12_4_ = uStack_618._4_4_ * fStack_2d4;
          auVar173._16_4_ = (float)uStack_610 * fStack_2d0;
          auVar173._20_4_ = uStack_610._4_4_ * fStack_2cc;
          auVar173._24_4_ = (float)uStack_608 * fStack_2c8;
          auVar173._28_4_ = 0;
          auVar171 = vfmadd213ps_fma(auVar122,_local_680,auVar173);
          auVar171 = vfmadd213ps_fma(auVar10,local_6c0,ZEXT1632(auVar171));
          auVar10 = *(undefined1 (*) [32])(lVar97 + 0x220557c + lVar101 * 4);
          auVar122 = *(undefined1 (*) [32])(lVar97 + 0x2205a00 + lVar101 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar97 + 0x2205e84 + lVar101 * 4);
          pfVar7 = (float *)(lVar97 + 0x2206308 + lVar101 * 4);
          fVar153 = *pfVar7;
          fVar152 = pfVar7[1];
          fVar123 = pfVar7[2];
          fVar124 = pfVar7[3];
          fVar125 = pfVar7[4];
          fVar126 = pfVar7[5];
          fVar127 = pfVar7[6];
          auVar48._4_4_ = fVar152 * fStack_5fc;
          auVar48._0_4_ = fVar153 * local_600;
          auVar48._8_4_ = fVar123 * fStack_5f8;
          auVar48._12_4_ = fVar124 * fStack_5f4;
          auVar48._16_4_ = fVar125 * fStack_5f0;
          auVar48._20_4_ = fVar126 * fStack_5ec;
          auVar48._24_4_ = fVar127 * fStack_5e8;
          auVar48._28_4_ = auVar110._28_4_;
          auVar49._4_4_ = fVar152 * fVar217;
          auVar49._0_4_ = fVar153 * fVar210;
          auVar49._8_4_ = fVar123 * fVar218;
          auVar49._12_4_ = fVar124 * fVar219;
          auVar49._16_4_ = fVar125 * fVar220;
          auVar49._20_4_ = fVar126 * fVar221;
          auVar49._24_4_ = fVar127 * fVar222;
          auVar49._28_4_ = pfVar6[7];
          auVar50._4_4_ = local_620._4_4_ * fVar152;
          auVar50._0_4_ = (float)local_620 * fVar153;
          auVar50._8_4_ = (float)uStack_618 * fVar123;
          auVar50._12_4_ = uStack_618._4_4_ * fVar124;
          auVar50._16_4_ = (float)uStack_610 * fVar125;
          auVar50._20_4_ = uStack_610._4_4_ * fVar126;
          auVar50._24_4_ = (float)uStack_608 * fVar127;
          auVar50._28_4_ = pfVar7[7];
          auVar109 = vfmadd231ps_fma(auVar48,auVar119,local_5c0);
          auVar154 = vfmadd231ps_fma(auVar49,auVar119,local_720);
          auVar105 = vfmadd231ps_fma(auVar50,_local_680,auVar119);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar122,auVar111);
          auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar122,local_4c0);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_6c0,auVar122);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar10,local_7a0);
          auVar90._8_8_ = uStack_498;
          auVar90._0_8_ = local_4a0;
          auVar90._16_8_ = uStack_490;
          auVar90._24_8_ = uStack_488;
          auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar10,auVar90);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_740,auVar10);
          pfVar6 = (float *)(lVar97 + 0x2208728 + lVar101 * 4);
          fVar153 = *pfVar6;
          fVar152 = pfVar6[1];
          fVar123 = pfVar6[2];
          fVar124 = pfVar6[3];
          fVar125 = pfVar6[4];
          fVar126 = pfVar6[5];
          fVar127 = pfVar6[6];
          auVar51._4_4_ = fStack_5fc * fVar152;
          auVar51._0_4_ = local_600 * fVar153;
          auVar51._8_4_ = fStack_5f8 * fVar123;
          auVar51._12_4_ = fStack_5f4 * fVar124;
          auVar51._16_4_ = fStack_5f0 * fVar125;
          auVar51._20_4_ = fStack_5ec * fVar126;
          auVar51._24_4_ = fStack_5e8 * fVar127;
          auVar51._28_4_ = local_6c0._28_4_;
          auVar52._4_4_ = fVar217 * fVar152;
          auVar52._0_4_ = fVar210 * fVar153;
          auVar52._8_4_ = fVar218 * fVar123;
          auVar52._12_4_ = fVar219 * fVar124;
          auVar52._16_4_ = fVar220 * fVar125;
          auVar52._20_4_ = fVar221 * fVar126;
          auVar52._24_4_ = fVar222 * fVar127;
          auVar52._28_4_ = auVar165._28_4_;
          auVar53._4_4_ = fVar152 * local_620._4_4_;
          auVar53._0_4_ = fVar153 * (float)local_620;
          auVar53._8_4_ = fVar123 * (float)uStack_618;
          auVar53._12_4_ = fVar124 * uStack_618._4_4_;
          auVar53._16_4_ = fVar125 * (float)uStack_610;
          auVar53._20_4_ = fVar126 * uStack_610._4_4_;
          auVar53._24_4_ = fVar127 * (float)uStack_608;
          auVar53._28_4_ = pfVar6[7];
          auVar10 = *(undefined1 (*) [32])(lVar97 + 0x22082a4 + lVar101 * 4);
          auVar131 = vfmadd231ps_fma(auVar51,auVar10,local_5c0);
          auVar166 = vfmadd231ps_fma(auVar52,auVar10,local_720);
          auVar177 = vfmadd231ps_fma(auVar53,_local_680,auVar10);
          auVar10 = *(undefined1 (*) [32])(lVar97 + 0x2207e20 + lVar101 * 4);
          auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar10,local_660);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar10,local_4c0);
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar10,local_6c0);
          auVar10 = *(undefined1 (*) [32])(lVar97 + 0x220799c + lVar101 * 4);
          auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar10,local_7a0);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar10,auVar90);
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),local_740,auVar10);
          auVar215._8_4_ = 0x7fffffff;
          auVar215._0_8_ = 0x7fffffff7fffffff;
          auVar215._12_4_ = 0x7fffffff;
          auVar215._16_4_ = 0x7fffffff;
          auVar215._20_4_ = 0x7fffffff;
          auVar215._24_4_ = 0x7fffffff;
          auVar215._28_4_ = 0x7fffffff;
          auVar10 = vandps_avx(ZEXT1632(auVar109),auVar215);
          auVar122 = vandps_avx(ZEXT1632(auVar154),auVar215);
          auVar122 = vmaxps_avx(auVar10,auVar122);
          auVar10 = vandps_avx(ZEXT1632(auVar105),auVar215);
          auVar10 = vmaxps_avx(auVar122,auVar10);
          auVar10 = vcmpps_avx(auVar10,_local_340,1);
          auVar110 = vblendvps_avx(ZEXT1632(auVar109),local_480,auVar10);
          auVar119 = vblendvps_avx(ZEXT1632(auVar154),local_500,auVar10);
          auVar10 = vandps_avx(ZEXT1632(auVar131),auVar215);
          auVar122 = vandps_avx(ZEXT1632(auVar166),auVar215);
          auVar122 = vmaxps_avx(auVar10,auVar122);
          auVar10 = vandps_avx(auVar215,ZEXT1632(auVar177));
          auVar10 = vmaxps_avx(auVar122,auVar10);
          auVar122 = vcmpps_avx(auVar10,_local_340,1);
          auVar10 = vblendvps_avx(ZEXT1632(auVar131),local_480,auVar122);
          auVar122 = vblendvps_avx(ZEXT1632(auVar166),local_500,auVar122);
          auVar171 = vfmadd213ps_fma(auVar113,local_740,ZEXT1632(auVar171));
          auVar109 = vfmadd213ps_fma(auVar110,auVar110,ZEXT832(0) << 0x20);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar119,auVar119);
          auVar113 = vrsqrtps_avx(ZEXT1632(auVar109));
          fVar153 = auVar113._0_4_;
          fVar152 = auVar113._4_4_;
          fVar123 = auVar113._8_4_;
          fVar124 = auVar113._12_4_;
          fVar125 = auVar113._16_4_;
          fVar126 = auVar113._20_4_;
          fVar127 = auVar113._24_4_;
          auVar54._4_4_ = fVar152 * fVar152 * fVar152 * auVar109._4_4_ * -0.5;
          auVar54._0_4_ = fVar153 * fVar153 * fVar153 * auVar109._0_4_ * -0.5;
          auVar54._8_4_ = fVar123 * fVar123 * fVar123 * auVar109._8_4_ * -0.5;
          auVar54._12_4_ = fVar124 * fVar124 * fVar124 * auVar109._12_4_ * -0.5;
          auVar54._16_4_ = fVar125 * fVar125 * fVar125 * -0.0;
          auVar54._20_4_ = fVar126 * fVar126 * fVar126 * -0.0;
          auVar54._24_4_ = fVar127 * fVar127 * fVar127 * -0.0;
          auVar54._28_4_ = 0;
          auVar240._8_4_ = 0x3fc00000;
          auVar240._0_8_ = 0x3fc000003fc00000;
          auVar240._12_4_ = 0x3fc00000;
          auVar240._16_4_ = 0x3fc00000;
          auVar240._20_4_ = 0x3fc00000;
          auVar240._24_4_ = 0x3fc00000;
          auVar240._28_4_ = 0x3fc00000;
          auVar109 = vfmadd231ps_fma(auVar54,auVar240,auVar113);
          fVar153 = auVar109._0_4_;
          fVar152 = auVar109._4_4_;
          auVar55._4_4_ = auVar119._4_4_ * fVar152;
          auVar55._0_4_ = auVar119._0_4_ * fVar153;
          fVar123 = auVar109._8_4_;
          auVar55._8_4_ = auVar119._8_4_ * fVar123;
          fVar124 = auVar109._12_4_;
          auVar55._12_4_ = auVar119._12_4_ * fVar124;
          auVar55._16_4_ = auVar119._16_4_ * 0.0;
          auVar55._20_4_ = auVar119._20_4_ * 0.0;
          auVar55._24_4_ = auVar119._24_4_ * 0.0;
          auVar55._28_4_ = auVar113._28_4_;
          auVar56._4_4_ = fVar152 * -auVar110._4_4_;
          auVar56._0_4_ = fVar153 * -auVar110._0_4_;
          auVar56._8_4_ = fVar123 * -auVar110._8_4_;
          auVar56._12_4_ = fVar124 * -auVar110._12_4_;
          auVar56._16_4_ = -auVar110._16_4_ * 0.0;
          auVar56._20_4_ = -auVar110._20_4_ * 0.0;
          auVar56._24_4_ = -auVar110._24_4_ * 0.0;
          auVar56._28_4_ = auVar119._28_4_;
          auVar109 = vfmadd213ps_fma(auVar10,auVar10,ZEXT832(0) << 0x20);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar122,auVar122);
          auVar113 = vrsqrtps_avx(ZEXT1632(auVar109));
          auVar57._28_4_ = local_480._28_4_;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar124 * 0.0,
                                  CONCAT48(fVar123 * 0.0,CONCAT44(fVar152 * 0.0,fVar153 * 0.0))));
          fVar153 = auVar113._0_4_;
          fVar152 = auVar113._4_4_;
          fVar123 = auVar113._8_4_;
          fVar124 = auVar113._12_4_;
          fVar125 = auVar113._16_4_;
          fVar126 = auVar113._20_4_;
          fVar127 = auVar113._24_4_;
          auVar58._4_4_ = fVar152 * fVar152 * fVar152 * auVar109._4_4_ * -0.5;
          auVar58._0_4_ = fVar153 * fVar153 * fVar153 * auVar109._0_4_ * -0.5;
          auVar58._8_4_ = fVar123 * fVar123 * fVar123 * auVar109._8_4_ * -0.5;
          auVar58._12_4_ = fVar124 * fVar124 * fVar124 * auVar109._12_4_ * -0.5;
          auVar58._16_4_ = fVar125 * fVar125 * fVar125 * -0.0;
          auVar58._20_4_ = fVar126 * fVar126 * fVar126 * -0.0;
          auVar58._24_4_ = fVar127 * fVar127 * fVar127 * -0.0;
          auVar58._28_4_ = 0;
          auVar109 = vfmadd231ps_fma(auVar58,auVar240,auVar113);
          fVar153 = auVar109._0_4_;
          fVar152 = auVar109._4_4_;
          auVar59._4_4_ = auVar122._4_4_ * fVar152;
          auVar59._0_4_ = auVar122._0_4_ * fVar153;
          fVar123 = auVar109._8_4_;
          auVar59._8_4_ = auVar122._8_4_ * fVar123;
          fVar124 = auVar109._12_4_;
          auVar59._12_4_ = auVar122._12_4_ * fVar124;
          auVar59._16_4_ = auVar122._16_4_ * 0.0;
          auVar59._20_4_ = auVar122._20_4_ * 0.0;
          auVar59._24_4_ = auVar122._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar60._4_4_ = fVar152 * -auVar10._4_4_;
          auVar60._0_4_ = fVar153 * -auVar10._0_4_;
          auVar60._8_4_ = fVar123 * -auVar10._8_4_;
          auVar60._12_4_ = fVar124 * -auVar10._12_4_;
          auVar60._16_4_ = -auVar10._16_4_ * 0.0;
          auVar60._20_4_ = -auVar10._20_4_ * 0.0;
          auVar60._24_4_ = -auVar10._24_4_ * 0.0;
          auVar60._28_4_ = auVar113._28_4_;
          auVar61._28_4_ = 0xbf000000;
          auVar61._0_28_ =
               ZEXT1628(CONCAT412(fVar124 * 0.0,
                                  CONCAT48(fVar123 * 0.0,CONCAT44(fVar152 * 0.0,fVar153 * 0.0))));
          auVar109 = vfmadd213ps_fma(auVar55,auVar146,local_5e0);
          auVar154 = vfmadd213ps_fma(auVar56,auVar146,auVar144);
          auVar105 = vfmadd213ps_fma(auVar57,auVar146,ZEXT1632(auVar171));
          auVar104 = vfnmadd213ps_fma(auVar55,auVar146,local_5e0);
          auVar131 = vfmadd213ps_fma(auVar59,auVar112,local_460);
          auVar129 = vfnmadd213ps_fma(auVar56,auVar146,auVar144);
          auVar166 = vfmadd213ps_fma(auVar60,auVar112,local_4e0);
          auVar192 = vfnmadd231ps_fma(ZEXT1632(auVar171),auVar146,auVar57);
          auVar171 = vfmadd213ps_fma(auVar61,auVar112,ZEXT1632(auVar20));
          auVar186 = vfnmadd213ps_fma(auVar59,auVar112,local_460);
          auVar191 = vfnmadd213ps_fma(auVar60,auVar112,local_4e0);
          auVar193 = vfnmadd231ps_fma(ZEXT1632(auVar20),auVar112,auVar61);
          auVar113 = vsubps_avx(ZEXT1632(auVar166),ZEXT1632(auVar129));
          auVar10 = vsubps_avx(ZEXT1632(auVar171),ZEXT1632(auVar192));
          auVar62._4_4_ = auVar113._4_4_ * auVar192._4_4_;
          auVar62._0_4_ = auVar113._0_4_ * auVar192._0_4_;
          auVar62._8_4_ = auVar113._8_4_ * auVar192._8_4_;
          auVar62._12_4_ = auVar113._12_4_ * auVar192._12_4_;
          auVar62._16_4_ = auVar113._16_4_ * 0.0;
          auVar62._20_4_ = auVar113._20_4_ * 0.0;
          auVar62._24_4_ = auVar113._24_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar177 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar129),auVar10);
          auVar63._4_4_ = auVar104._4_4_ * auVar10._4_4_;
          auVar63._0_4_ = auVar104._0_4_ * auVar10._0_4_;
          auVar63._8_4_ = auVar104._8_4_ * auVar10._8_4_;
          auVar63._12_4_ = auVar104._12_4_ * auVar10._12_4_;
          auVar63._16_4_ = auVar10._16_4_ * 0.0;
          auVar63._20_4_ = auVar10._20_4_ * 0.0;
          auVar63._24_4_ = auVar10._24_4_ * 0.0;
          auVar63._28_4_ = auVar10._28_4_;
          auVar141 = ZEXT1632(auVar104);
          auVar10 = vsubps_avx(ZEXT1632(auVar131),auVar141);
          auVar118 = ZEXT1632(auVar192);
          auVar20 = vfmsub231ps_fma(auVar63,auVar118,auVar10);
          auVar64._4_4_ = auVar129._4_4_ * auVar10._4_4_;
          auVar64._0_4_ = auVar129._0_4_ * auVar10._0_4_;
          auVar64._8_4_ = auVar129._8_4_ * auVar10._8_4_;
          auVar64._12_4_ = auVar129._12_4_ * auVar10._12_4_;
          auVar64._16_4_ = auVar10._16_4_ * 0.0;
          auVar64._20_4_ = auVar10._20_4_ * 0.0;
          auVar64._24_4_ = auVar10._24_4_ * 0.0;
          auVar64._28_4_ = auVar10._28_4_;
          auVar104 = vfmsub231ps_fma(auVar64,auVar141,auVar113);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar177));
          auVar144 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
          auVar113 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar109),auVar144);
          auVar10 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar154),auVar144);
          auVar122 = vblendvps_avx(ZEXT1632(auVar193),ZEXT1632(auVar105),auVar144);
          auVar110 = vblendvps_avx(auVar141,ZEXT1632(auVar131),auVar144);
          auVar119 = vblendvps_avx(ZEXT1632(auVar129),ZEXT1632(auVar166),auVar144);
          auVar117 = vblendvps_avx(auVar118,ZEXT1632(auVar171),auVar144);
          auVar141 = vblendvps_avx(ZEXT1632(auVar131),auVar141,auVar144);
          auVar21 = vblendvps_avx(ZEXT1632(auVar166),ZEXT1632(auVar129),auVar144);
          auVar20 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
          auVar118 = vblendvps_avx(ZEXT1632(auVar171),auVar118,auVar144);
          auVar141 = vsubps_avx(auVar141,auVar113);
          auVar21 = vsubps_avx(auVar21,auVar10);
          auVar111 = vsubps_avx(auVar118,auVar122);
          auVar136 = vsubps_avx(auVar113,auVar110);
          auVar137 = vsubps_avx(auVar10,auVar119);
          auVar161 = vsubps_avx(auVar122,auVar117);
          auVar188._0_4_ = auVar111._0_4_ * auVar113._0_4_;
          auVar188._4_4_ = auVar111._4_4_ * auVar113._4_4_;
          auVar188._8_4_ = auVar111._8_4_ * auVar113._8_4_;
          auVar188._12_4_ = auVar111._12_4_ * auVar113._12_4_;
          auVar188._16_4_ = auVar111._16_4_ * auVar113._16_4_;
          auVar188._20_4_ = auVar111._20_4_ * auVar113._20_4_;
          auVar188._24_4_ = auVar111._24_4_ * auVar113._24_4_;
          auVar188._28_4_ = 0;
          auVar171 = vfmsub231ps_fma(auVar188,auVar122,auVar141);
          auVar65._4_4_ = auVar141._4_4_ * auVar10._4_4_;
          auVar65._0_4_ = auVar141._0_4_ * auVar10._0_4_;
          auVar65._8_4_ = auVar141._8_4_ * auVar10._8_4_;
          auVar65._12_4_ = auVar141._12_4_ * auVar10._12_4_;
          auVar65._16_4_ = auVar141._16_4_ * auVar10._16_4_;
          auVar65._20_4_ = auVar141._20_4_ * auVar10._20_4_;
          auVar65._24_4_ = auVar141._24_4_ * auVar10._24_4_;
          auVar65._28_4_ = auVar118._28_4_;
          auVar109 = vfmsub231ps_fma(auVar65,auVar113,auVar21);
          auVar171 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT832(0) << 0x20,ZEXT1632(auVar171));
          auVar189._0_4_ = auVar21._0_4_ * auVar122._0_4_;
          auVar189._4_4_ = auVar21._4_4_ * auVar122._4_4_;
          auVar189._8_4_ = auVar21._8_4_ * auVar122._8_4_;
          auVar189._12_4_ = auVar21._12_4_ * auVar122._12_4_;
          auVar189._16_4_ = auVar21._16_4_ * auVar122._16_4_;
          auVar189._20_4_ = auVar21._20_4_ * auVar122._20_4_;
          auVar189._24_4_ = auVar21._24_4_ * auVar122._24_4_;
          auVar189._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar189,auVar10,auVar111);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar171),ZEXT832(0) << 0x20,ZEXT1632(auVar109));
          auVar190._0_4_ = auVar161._0_4_ * auVar110._0_4_;
          auVar190._4_4_ = auVar161._4_4_ * auVar110._4_4_;
          auVar190._8_4_ = auVar161._8_4_ * auVar110._8_4_;
          auVar190._12_4_ = auVar161._12_4_ * auVar110._12_4_;
          auVar190._16_4_ = auVar161._16_4_ * auVar110._16_4_;
          auVar190._20_4_ = auVar161._20_4_ * auVar110._20_4_;
          auVar190._24_4_ = auVar161._24_4_ * auVar110._24_4_;
          auVar190._28_4_ = 0;
          auVar171 = vfmsub231ps_fma(auVar190,auVar136,auVar117);
          auVar66._4_4_ = auVar137._4_4_ * auVar117._4_4_;
          auVar66._0_4_ = auVar137._0_4_ * auVar117._0_4_;
          auVar66._8_4_ = auVar137._8_4_ * auVar117._8_4_;
          auVar66._12_4_ = auVar137._12_4_ * auVar117._12_4_;
          auVar66._16_4_ = auVar137._16_4_ * auVar117._16_4_;
          auVar66._20_4_ = auVar137._20_4_ * auVar117._20_4_;
          auVar66._24_4_ = auVar137._24_4_ * auVar117._24_4_;
          auVar66._28_4_ = auVar113._28_4_;
          auVar154 = vfmsub231ps_fma(auVar66,auVar119,auVar161);
          auVar67._4_4_ = auVar136._4_4_ * auVar119._4_4_;
          auVar67._0_4_ = auVar136._0_4_ * auVar119._0_4_;
          auVar67._8_4_ = auVar136._8_4_ * auVar119._8_4_;
          auVar67._12_4_ = auVar136._12_4_ * auVar119._12_4_;
          auVar67._16_4_ = auVar136._16_4_ * auVar119._16_4_;
          auVar67._20_4_ = auVar136._20_4_ * auVar119._20_4_;
          auVar67._24_4_ = auVar136._24_4_ * auVar119._24_4_;
          auVar67._28_4_ = auVar119._28_4_;
          auVar105 = vfmsub231ps_fma(auVar67,auVar137,auVar110);
          auVar119 = ZEXT832(0) << 0x20;
          auVar171 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar119,ZEXT1632(auVar171));
          auVar154 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar119,ZEXT1632(auVar154));
          auVar110 = vmaxps_avx(ZEXT1632(auVar109),ZEXT1632(auVar154));
          auVar110 = vcmpps_avx(auVar110,auVar119,2);
          auVar105 = auVar110._16_16_;
          auVar171 = vpackssdw_avx(auVar110._0_16_,auVar105);
          auVar20 = vpand_avx(auVar171,auVar20);
          auVar110 = vpmovsxwd_avx2(auVar20);
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar110 >> 0x7f,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0xbf,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar110[0x1f]) {
LAB_011792cf:
            auVar200 = ZEXT1664(auVar105);
            auVar175._8_8_ = uStack_558;
            auVar175._0_8_ = local_560;
            auVar175._16_8_ = uStack_550;
            auVar175._24_8_ = uStack_548;
          }
          else {
            auVar68._4_4_ = auVar21._4_4_ * auVar161._4_4_;
            auVar68._0_4_ = auVar21._0_4_ * auVar161._0_4_;
            auVar68._8_4_ = auVar21._8_4_ * auVar161._8_4_;
            auVar68._12_4_ = auVar21._12_4_ * auVar161._12_4_;
            auVar68._16_4_ = auVar21._16_4_ * auVar161._16_4_;
            auVar68._20_4_ = auVar21._20_4_ * auVar161._20_4_;
            auVar68._24_4_ = auVar21._24_4_ * auVar161._24_4_;
            auVar68._28_4_ = auVar110._28_4_;
            auVar166 = vfmsub231ps_fma(auVar68,auVar137,auVar111);
            auVar199._0_4_ = auVar111._0_4_ * auVar136._0_4_;
            auVar199._4_4_ = auVar111._4_4_ * auVar136._4_4_;
            auVar199._8_4_ = auVar111._8_4_ * auVar136._8_4_;
            auVar199._12_4_ = auVar111._12_4_ * auVar136._12_4_;
            auVar199._16_4_ = auVar111._16_4_ * auVar136._16_4_;
            auVar199._20_4_ = auVar111._20_4_ * auVar136._20_4_;
            auVar199._24_4_ = auVar111._24_4_ * auVar136._24_4_;
            auVar199._28_4_ = 0;
            auVar105 = vfmsub231ps_fma(auVar199,auVar141,auVar161);
            auVar69._4_4_ = auVar141._4_4_ * auVar137._4_4_;
            auVar69._0_4_ = auVar141._0_4_ * auVar137._0_4_;
            auVar69._8_4_ = auVar141._8_4_ * auVar137._8_4_;
            auVar69._12_4_ = auVar141._12_4_ * auVar137._12_4_;
            auVar69._16_4_ = auVar141._16_4_ * auVar137._16_4_;
            auVar69._20_4_ = auVar141._20_4_ * auVar137._20_4_;
            auVar69._24_4_ = auVar141._24_4_ * auVar137._24_4_;
            auVar69._28_4_ = auVar137._28_4_;
            auVar177 = vfmsub231ps_fma(auVar69,auVar136,auVar21);
            auVar171 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar177));
            auVar131 = vfmadd231ps_fma(ZEXT1632(auVar171),ZEXT1632(auVar166),auVar119);
            auVar110 = vrcpps_avx(ZEXT1632(auVar131));
            auVar231._8_4_ = 0x3f800000;
            auVar231._0_8_ = 0x3f8000003f800000;
            auVar231._12_4_ = 0x3f800000;
            auVar231._16_4_ = 0x3f800000;
            auVar231._20_4_ = 0x3f800000;
            auVar231._24_4_ = 0x3f800000;
            auVar231._28_4_ = 0x3f800000;
            auVar171 = vfnmadd213ps_fma(auVar110,ZEXT1632(auVar131),auVar231);
            auVar171 = vfmadd132ps_fma(ZEXT1632(auVar171),auVar110,auVar110);
            auVar70._4_4_ = auVar177._4_4_ * auVar122._4_4_;
            auVar70._0_4_ = auVar177._0_4_ * auVar122._0_4_;
            auVar70._8_4_ = auVar177._8_4_ * auVar122._8_4_;
            auVar70._12_4_ = auVar177._12_4_ * auVar122._12_4_;
            auVar70._16_4_ = auVar122._16_4_ * 0.0;
            auVar70._20_4_ = auVar122._20_4_ * 0.0;
            auVar70._24_4_ = auVar122._24_4_ * 0.0;
            auVar70._28_4_ = auVar10._28_4_;
            auVar105 = vfmadd231ps_fma(auVar70,ZEXT1632(auVar105),auVar10);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar166),auVar113);
            fVar153 = auVar171._0_4_;
            fVar152 = auVar171._4_4_;
            fVar123 = auVar171._8_4_;
            fVar124 = auVar171._12_4_;
            auVar110 = ZEXT1632(CONCAT412(fVar124 * auVar105._12_4_,
                                          CONCAT48(fVar123 * auVar105._8_4_,
                                                   CONCAT44(fVar152 * auVar105._4_4_,
                                                            fVar153 * auVar105._0_4_))));
            uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar174._4_4_ = uVar99;
            auVar174._0_4_ = uVar99;
            auVar174._8_4_ = uVar99;
            auVar174._12_4_ = uVar99;
            auVar174._16_4_ = uVar99;
            auVar174._20_4_ = uVar99;
            auVar174._24_4_ = uVar99;
            auVar174._28_4_ = uVar99;
            auVar91._4_4_ = uStack_fc;
            auVar91._0_4_ = local_100;
            auVar91._8_4_ = uStack_f8;
            auVar91._12_4_ = uStack_f4;
            auVar91._16_4_ = uStack_f0;
            auVar91._20_4_ = uStack_ec;
            auVar91._24_4_ = uStack_e8;
            auVar91._28_4_ = uStack_e4;
            auVar113 = vcmpps_avx(auVar91,auVar110,2);
            auVar10 = vcmpps_avx(auVar110,auVar174,2);
            auVar113 = vandps_avx(auVar10,auVar113);
            auVar171 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
            auVar20 = vpand_avx(auVar20,auVar171);
            auVar113 = vpmovsxwd_avx2(auVar20);
            auVar105 = ZEXT816(0) << 0x20;
            if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar113 >> 0x7f,0) == '\0') &&
                  (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0xbf,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar113[0x1f]) goto LAB_011792cf;
            auVar113 = vcmpps_avx(ZEXT1632(auVar131),ZEXT832(0) << 0x20,4);
            auVar171 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
            auVar20 = vpand_avx(auVar20,auVar171);
            auVar113 = vpmovsxwd_avx2(auVar20);
            auVar200 = ZEXT3264(auVar113);
            auVar175._8_8_ = uStack_558;
            auVar175._0_8_ = local_560;
            auVar175._16_8_ = uStack_550;
            auVar175._24_8_ = uStack_548;
            if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar113 >> 0x7f,0) != '\0') ||
                  (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar113 >> 0xbf,0) != '\0') ||
                (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar113[0x1f] < '\0') {
              auVar119 = ZEXT1632(CONCAT412(fVar124 * auVar109._12_4_,
                                            CONCAT48(fVar123 * auVar109._8_4_,
                                                     CONCAT44(fVar152 * auVar109._4_4_,
                                                              fVar153 * auVar109._0_4_))));
              auVar71._28_4_ = SUB84(uStack_548,4);
              auVar71._0_28_ =
                   ZEXT1628(CONCAT412(fVar124 * auVar154._12_4_,
                                      CONCAT48(fVar123 * auVar154._8_4_,
                                               CONCAT44(fVar152 * auVar154._4_4_,
                                                        fVar153 * auVar154._0_4_))));
              auVar209._8_4_ = 0x3f800000;
              auVar209._0_8_ = 0x3f8000003f800000;
              auVar209._12_4_ = 0x3f800000;
              auVar209._16_4_ = 0x3f800000;
              auVar209._20_4_ = 0x3f800000;
              auVar209._24_4_ = 0x3f800000;
              auVar209._28_4_ = 0x3f800000;
              auVar10 = vsubps_avx(auVar209,auVar119);
              local_6a0 = vblendvps_avx(auVar10,auVar119,auVar144);
              auVar10 = vsubps_avx(auVar209,auVar71);
              local_3a0 = vblendvps_avx(auVar10,auVar71,auVar144);
              local_380 = auVar110;
              auVar175 = auVar113;
            }
          }
          auVar241 = ZEXT3264(local_7a0);
          auVar235 = ZEXT3264(auVar112);
          auVar216 = ZEXT3264(CONCAT428(fStack_624,
                                        CONCAT424(fStack_628,
                                                  CONCAT420(fStack_62c,
                                                            CONCAT416(fStack_630,
                                                                      CONCAT412(fStack_634,
                                                                                CONCAT48(fStack_638,
                                                                                         CONCAT44(
                                                  fStack_63c,local_640))))))));
          local_520 = auVar146;
          if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar175 >> 0x7f,0) == '\0') &&
                (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar175 >> 0xbf,0) == '\0') &&
              (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar175[0x1f]) {
            auVar151 = ZEXT3264(local_6a0);
            auVar185 = ZEXT3264(CONCAT428(fStack_5e4,
                                          CONCAT424(fStack_5e8,
                                                    CONCAT420(fStack_5ec,
                                                              CONCAT416(fStack_5f0,
                                                                        CONCAT412(fStack_5f4,
                                                                                  CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
            auVar165 = ZEXT3264(local_660);
            auVar206 = ZEXT3264(local_720);
          }
          else {
            auVar113 = vsubps_avx(auVar112,auVar146);
            auVar20 = vfmadd213ps_fma(auVar113,local_6a0,auVar146);
            fVar153 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar72._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar153;
            auVar72._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar153;
            auVar72._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar153;
            auVar72._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar153;
            auVar72._16_4_ = fVar153 * 0.0;
            auVar72._20_4_ = fVar153 * 0.0;
            auVar72._24_4_ = fVar153 * 0.0;
            auVar72._28_4_ = fVar153;
            auVar113 = vcmpps_avx(local_380,auVar72,6);
            auVar10 = auVar175 & auVar113;
            auVar165 = ZEXT3264(local_660);
            auVar206 = ZEXT3264(local_720);
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar10 >> 0x7f,0) == '\0') &&
                  (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar10 >> 0xbf,0) == '\0') &&
                (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar10[0x1f]) {
              auVar151 = ZEXT3264(local_6a0);
              auVar185 = ZEXT3264(CONCAT428(fStack_5e4,
                                            CONCAT424(fStack_5e8,
                                                      CONCAT420(fStack_5ec,
                                                                CONCAT416(fStack_5f0,
                                                                          CONCAT412(fStack_5f4,
                                                                                    CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
            }
            else {
              auVar147._8_4_ = 0xbf800000;
              auVar147._0_8_ = 0xbf800000bf800000;
              auVar147._12_4_ = 0xbf800000;
              auVar147._16_4_ = 0xbf800000;
              auVar147._20_4_ = 0xbf800000;
              auVar147._24_4_ = 0xbf800000;
              auVar147._28_4_ = 0xbf800000;
              auVar164._8_4_ = 0x40000000;
              auVar164._0_8_ = 0x4000000040000000;
              auVar164._12_4_ = 0x40000000;
              auVar164._16_4_ = 0x40000000;
              auVar164._20_4_ = 0x40000000;
              auVar164._24_4_ = 0x40000000;
              auVar164._28_4_ = 0x40000000;
              auVar20 = vfmadd213ps_fma(local_3a0,auVar164,auVar147);
              auVar200 = ZEXT1664(auVar20);
              local_280 = local_6a0;
              local_3a0 = ZEXT1632(auVar20);
              auVar10 = local_3a0;
              local_260 = ZEXT1632(auVar20);
              local_240 = local_380;
              local_21c = iVar15;
              local_210 = uVar79;
              uStack_208 = uVar80;
              local_200 = uVar81;
              uStack_1f8 = uVar82;
              local_1f0 = uVar83;
              uStack_1e8 = uVar84;
              local_1e0 = uVar85;
              uStack_1d8 = uVar86;
              pGVar17 = (context->scene->geometries).items[uVar94].ptr;
              auVar12._4_4_ = fStack_5fc;
              auVar12._0_4_ = local_600;
              auVar12._8_4_ = fStack_5f8;
              auVar12._12_4_ = fStack_5f4;
              auVar12._16_4_ = fStack_5f0;
              auVar12._20_4_ = fStack_5ec;
              auVar12._24_4_ = fStack_5e8;
              auVar12._28_4_ = fStack_5e4;
              if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                local_5a0 = vandps_avx(auVar113,auVar175);
                fVar153 = (float)local_220;
                local_1a0[0] = (fVar153 + local_6a0._0_4_ + 0.0) * local_120;
                local_1a0[1] = (fVar153 + local_6a0._4_4_ + 1.0) * fStack_11c;
                local_1a0[2] = (fVar153 + local_6a0._8_4_ + 2.0) * fStack_118;
                local_1a0[3] = (fVar153 + local_6a0._12_4_ + 3.0) * fStack_114;
                fStack_190 = (fVar153 + local_6a0._16_4_ + 4.0) * fStack_110;
                fStack_18c = (fVar153 + local_6a0._20_4_ + 5.0) * fStack_10c;
                fStack_188 = (fVar153 + local_6a0._24_4_ + 6.0) * fStack_108;
                fStack_184 = fVar153 + local_6a0._28_4_ + 7.0;
                local_3a0._0_8_ = auVar20._0_8_;
                local_3a0._8_8_ = auVar20._8_8_;
                local_180 = local_3a0._0_8_;
                uStack_178 = local_3a0._8_8_;
                uStack_170 = 0;
                uStack_168 = 0;
                local_160 = local_380;
                auVar148._8_4_ = 0x7f800000;
                auVar148._0_8_ = 0x7f8000007f800000;
                auVar148._12_4_ = 0x7f800000;
                auVar148._16_4_ = 0x7f800000;
                auVar148._20_4_ = 0x7f800000;
                auVar148._24_4_ = 0x7f800000;
                auVar148._28_4_ = 0x7f800000;
                auVar113 = vblendvps_avx(auVar148,local_380,local_5a0);
                auVar110 = vshufps_avx(auVar113,auVar113,0xb1);
                auVar110 = vminps_avx(auVar113,auVar110);
                auVar119 = vshufpd_avx(auVar110,auVar110,5);
                auVar110 = vminps_avx(auVar110,auVar119);
                auVar119 = vpermpd_avx2(auVar110,0x4e);
                auVar110 = vminps_avx(auVar110,auVar119);
                auVar110 = vcmpps_avx(auVar113,auVar110,0);
                auVar119 = local_5a0 & auVar110;
                auVar113 = local_5a0;
                if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar119 >> 0x7f,0) != '\0') ||
                      (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar119 >> 0xbf,0) != '\0') ||
                    (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar119[0x1f] < '\0') {
                  auVar113 = vandps_avx(auVar110,local_5a0);
                }
                uVar95 = vmovmskps_avx(auVar113);
                uVar14 = 0;
                for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
                  uVar14 = uVar14 + 1;
                }
                uVar96 = (ulong)uVar14;
                local_3a0 = auVar10;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar153 = local_1a0[uVar96];
                  fVar152 = 1.0 - fVar153;
                  auVar109 = ZEXT416((uint)fVar153);
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,
                                            ZEXT416(0xc0a00000));
                  auVar171 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153 * 3.0)),
                                             ZEXT416((uint)(fVar153 + fVar153)),auVar20);
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar109,
                                            ZEXT416(0x40000000));
                  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * -3.0)),
                                            ZEXT416((uint)(fVar152 + fVar152)),auVar20);
                  auVar154 = vfnmadd231ss_fma(ZEXT416((uint)(fVar153 * (fVar152 + fVar152))),
                                              ZEXT416((uint)fVar152),ZEXT416((uint)fVar152));
                  auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153)),auVar109,
                                             ZEXT416((uint)(fVar152 * -2.0)));
                  auVar200 = ZEXT464(0x3f000000);
                  fVar152 = auVar20._0_4_ * 0.5;
                  fVar123 = auVar109._0_4_ * 0.5;
                  auVar169._0_4_ = fVar123 * local_840;
                  auVar169._4_4_ = fVar123 * fStack_83c;
                  auVar169._8_4_ = fVar123 * fStack_838;
                  auVar169._12_4_ = fVar123 * fStack_834;
                  auVar133._4_4_ = fVar152;
                  auVar133._0_4_ = fVar152;
                  auVar133._8_4_ = fVar152;
                  auVar133._12_4_ = fVar152;
                  auVar20 = vfmadd132ps_fma(auVar133,auVar169,auVar22);
                  fVar152 = auVar171._0_4_ * 0.5;
                  auVar170._4_4_ = fVar152;
                  auVar170._0_4_ = fVar152;
                  auVar170._8_4_ = fVar152;
                  auVar170._12_4_ = fVar152;
                  auVar20 = vfmadd132ps_fma(auVar170,auVar20,auVar23);
                  uVar99 = *(undefined4 *)((long)&local_180 + uVar96 * 4);
                  fVar152 = auVar154._0_4_ * 0.5;
                  auVar156._4_4_ = fVar152;
                  auVar156._0_4_ = fVar152;
                  auVar156._8_4_ = fVar152;
                  auVar156._12_4_ = fVar152;
                  auVar20 = vfmadd132ps_fma(auVar156,auVar20,auVar24);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar96 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar20._0_4_;
                  uVar227 = vextractps_avx(auVar20,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar227;
                  uVar227 = vextractps_avx(auVar20,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar227;
                  *(float *)(ray + k * 4 + 0xf0) = fVar153;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar99;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_7a8;
                  *(uint *)(ray + k * 4 + 0x120) = uVar94;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  stack0xfffffffffffff908 = auVar122._8_24_;
                  auVar20 = *local_6d8;
                  local_7e0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                  local_6e0 = ray;
                  _local_2e0 = auVar19;
                  while( true ) {
                    auVar113 = local_7e0;
                    fVar153 = local_1a0[uVar96];
                    local_400._4_4_ = fVar153;
                    local_400._0_4_ = fVar153;
                    local_400._8_4_ = fVar153;
                    local_400._12_4_ = fVar153;
                    local_3f0 = *(undefined4 *)((long)&local_180 + uVar96 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar96 * 4);
                    fVar152 = 1.0 - fVar153;
                    auVar171 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_400,
                                               ZEXT416(0xc0a00000));
                    auVar154 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153 * 3.0)),
                                               ZEXT416((uint)(fVar153 + fVar153)),auVar171);
                    auVar200 = ZEXT1664(auVar154);
                    auVar171 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_400,
                                               ZEXT416(0x40000000));
                    auVar171 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * -3.0)),
                                               ZEXT416((uint)(fVar152 + fVar152)),auVar171);
                    auVar105 = vfnmadd231ss_fma(ZEXT416((uint)(fVar153 * (fVar152 + fVar152))),
                                                ZEXT416((uint)fVar152),ZEXT416((uint)fVar152));
                    auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153)),local_400,
                                               ZEXT416((uint)(fVar152 * -2.0)));
                    fVar153 = auVar171._0_4_ * 0.5;
                    fVar152 = auVar109._0_4_ * 0.5;
                    auVar179._0_4_ = fVar152 * local_840;
                    auVar179._4_4_ = fVar152 * fStack_83c;
                    auVar179._8_4_ = fVar152 * fStack_838;
                    auVar179._12_4_ = fVar152 * fStack_834;
                    auVar157._4_4_ = fVar153;
                    auVar157._0_4_ = fVar153;
                    auVar157._8_4_ = fVar153;
                    auVar157._12_4_ = fVar153;
                    auVar171 = vfmadd132ps_fma(auVar157,auVar179,auVar107);
                    fVar153 = auVar154._0_4_ * 0.5;
                    auVar180._4_4_ = fVar153;
                    auVar180._0_4_ = fVar153;
                    auVar180._8_4_ = fVar153;
                    auVar180._12_4_ = fVar153;
                    auVar171 = vfmadd132ps_fma(auVar180,auVar171,auVar106);
                    local_770.context = context->user;
                    fVar153 = auVar105._0_4_ * 0.5;
                    auVar158._4_4_ = fVar153;
                    auVar158._0_4_ = fVar153;
                    auVar158._8_4_ = fVar153;
                    auVar158._12_4_ = fVar153;
                    auVar109 = vfmadd132ps_fma(auVar158,auVar171,auVar130);
                    local_430 = auVar109._0_4_;
                    uStack_42c = local_430;
                    uStack_428 = local_430;
                    uStack_424 = local_430;
                    auVar171 = vshufps_avx(auVar109,auVar109,0x55);
                    local_420 = auVar171;
                    local_410 = vshufps_avx(auVar109,auVar109,0xaa);
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    local_3e0 = CONCAT44(uStack_2bc,local_2c0);
                    uStack_3d8 = CONCAT44(uStack_2b4,uStack_2b8);
                    local_3d0._4_4_ = uStack_2ac;
                    local_3d0._0_4_ = local_2b0;
                    local_3d0._8_4_ = uStack_2a8;
                    local_3d0._12_4_ = uStack_2a4;
                    vpcmpeqd_avx2(ZEXT1632(local_3d0),ZEXT1632(local_3d0));
                    uStack_3bc = (local_770.context)->instID[0];
                    local_3c0 = uStack_3bc;
                    uStack_3b8 = uStack_3bc;
                    uStack_3b4 = uStack_3bc;
                    uStack_3b0 = (local_770.context)->instPrimID[0];
                    uStack_3ac = uStack_3b0;
                    uStack_3a8 = uStack_3b0;
                    uStack_3a4 = uStack_3b0;
                    local_770.valid = (int *)local_7c0;
                    local_770.geometryUserPtr = pGVar17->userPtr;
                    local_770.hit = (RTCHitN *)&local_430;
                    local_770.N = 4;
                    local_7c0 = auVar20;
                    local_770.ray = (RTCRayN *)ray;
                    if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar200 = ZEXT1664(auVar154);
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      (*pGVar17->intersectionFilterN)(&local_770);
                      ray = local_6e0;
                    }
                    if (local_7c0 == (undefined1  [16])0x0) {
                      auVar171 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar109 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                      auVar171 = auVar171 ^ auVar109;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      auVar109 = vpcmpeqd_avx(auVar171,auVar171);
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar200 = ZEXT1664(auVar200._0_16_);
                        auVar235 = ZEXT1664(auVar235._0_16_);
                        (*p_Var18)(&local_770);
                        auVar109 = vpcmpeqd_avx(auVar109,auVar109);
                        ray = local_6e0;
                      }
                      auVar154 = vpcmpeqd_avx(local_7c0,_DAT_01f45a50);
                      auVar171 = auVar154 ^ auVar109;
                      if (local_7c0 != (undefined1  [16])0x0) {
                        auVar154 = auVar154 ^ auVar109;
                        auVar109 = vmaskmovps_avx(auVar154,*(undefined1 (*) [16])local_770.hit);
                        *(undefined1 (*) [16])(local_770.ray + 0xc0) = auVar109;
                        auVar109 = vmaskmovps_avx(auVar154,*(undefined1 (*) [16])
                                                            (local_770.hit + 0x10));
                        *(undefined1 (*) [16])(local_770.ray + 0xd0) = auVar109;
                        auVar109 = vmaskmovps_avx(auVar154,*(undefined1 (*) [16])
                                                            (local_770.hit + 0x20));
                        *(undefined1 (*) [16])(local_770.ray + 0xe0) = auVar109;
                        auVar109 = vmaskmovps_avx(auVar154,*(undefined1 (*) [16])
                                                            (local_770.hit + 0x30));
                        *(undefined1 (*) [16])(local_770.ray + 0xf0) = auVar109;
                        auVar109 = vmaskmovps_avx(auVar154,*(undefined1 (*) [16])
                                                            (local_770.hit + 0x40));
                        *(undefined1 (*) [16])(local_770.ray + 0x100) = auVar109;
                        auVar109 = vmaskmovps_avx(auVar154,*(undefined1 (*) [16])
                                                            (local_770.hit + 0x50));
                        *(undefined1 (*) [16])(local_770.ray + 0x110) = auVar109;
                        auVar109 = vmaskmovps_avx(auVar154,*(undefined1 (*) [16])
                                                            (local_770.hit + 0x60));
                        *(undefined1 (*) [16])(local_770.ray + 0x120) = auVar109;
                        auVar109 = vmaskmovps_avx(auVar154,*(undefined1 (*) [16])
                                                            (local_770.hit + 0x70));
                        *(undefined1 (*) [16])(local_770.ray + 0x130) = auVar109;
                        auVar109 = vmaskmovps_avx(auVar154,*(undefined1 (*) [16])
                                                            (local_770.hit + 0x80));
                        *(undefined1 (*) [16])(local_770.ray + 0x140) = auVar109;
                      }
                    }
                    auVar10 = local_380;
                    auVar134._8_8_ = 0x100000001;
                    auVar134._0_8_ = 0x100000001;
                    if ((auVar134 & auVar171) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_7e0._0_4_;
                    }
                    else {
                      local_7e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_7e0._4_4_ = 0;
                      local_7e0._8_4_ = 0;
                      local_7e0._12_4_ = 0;
                    }
                    *(undefined4 *)(local_5a0 + uVar96 * 4) = 0;
                    local_7e0._16_16_ = auVar113._16_16_;
                    auVar120._4_4_ = local_7e0._0_4_;
                    auVar120._0_4_ = local_7e0._0_4_;
                    auVar120._8_4_ = local_7e0._0_4_;
                    auVar120._12_4_ = local_7e0._0_4_;
                    auVar120._16_4_ = local_7e0._0_4_;
                    auVar120._20_4_ = local_7e0._0_4_;
                    auVar120._24_4_ = local_7e0._0_4_;
                    auVar120._28_4_ = local_7e0._0_4_;
                    auVar122 = vcmpps_avx(auVar10,auVar120,2);
                    auVar113 = vandps_avx(auVar122,local_5a0);
                    local_5a0 = local_5a0 & auVar122;
                    if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_5a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_5a0 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_5a0 >> 0x7f,0) == '\0') &&
                          (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_5a0 >> 0xbf,0) == '\0') &&
                        (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_5a0[0x1f]) break;
                    auVar149._8_4_ = 0x7f800000;
                    auVar149._0_8_ = 0x7f8000007f800000;
                    auVar149._12_4_ = 0x7f800000;
                    auVar149._16_4_ = 0x7f800000;
                    auVar149._20_4_ = 0x7f800000;
                    auVar149._24_4_ = 0x7f800000;
                    auVar149._28_4_ = 0x7f800000;
                    auVar10 = vblendvps_avx(auVar149,auVar10,auVar113);
                    auVar122 = vshufps_avx(auVar10,auVar10,0xb1);
                    auVar122 = vminps_avx(auVar10,auVar122);
                    auVar110 = vshufpd_avx(auVar122,auVar122,5);
                    auVar122 = vminps_avx(auVar122,auVar110);
                    auVar110 = vpermpd_avx2(auVar122,0x4e);
                    auVar122 = vminps_avx(auVar122,auVar110);
                    auVar122 = vcmpps_avx(auVar10,auVar122,0);
                    auVar110 = auVar113 & auVar122;
                    auVar10 = auVar113;
                    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0x7f,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar110 >> 0xbf,0) != '\0') ||
                        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar110[0x1f] < '\0') {
                      auVar10 = vandps_avx(auVar122,auVar113);
                    }
                    uVar95 = vmovmskps_avx(auVar10);
                    uVar14 = 0;
                    for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
                      uVar14 = uVar14 + 1;
                    }
                    uVar96 = (ulong)uVar14;
                    local_5a0 = auVar113;
                  }
                  auVar206 = ZEXT3264(local_720);
                  auVar216 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  auVar241 = ZEXT3264(local_7a0);
                  pre = local_7b0;
                }
                auVar12._4_4_ = fStack_5fc;
                auVar12._0_4_ = local_600;
                auVar12._8_4_ = fStack_5f8;
                auVar12._12_4_ = fStack_5f4;
                auVar12._16_4_ = fStack_5f0;
                auVar12._20_4_ = fStack_5ec;
                auVar12._24_4_ = fStack_5e8;
                auVar12._28_4_ = fStack_5e4;
              }
              auVar185 = ZEXT3264(auVar12);
              auVar151 = ZEXT3264(local_6a0);
              auVar165 = ZEXT3264(local_660);
            }
          }
        }
        auVar11._8_8_ = uStack_498;
        auVar11._0_8_ = local_4a0;
        auVar11._16_8_ = uStack_490;
        auVar11._24_8_ = uStack_488;
        auVar176 = ZEXT3264(local_5c0);
      }
    }
    uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar108._4_4_ = uVar99;
    auVar108._0_4_ = uVar99;
    auVar108._8_4_ = uVar99;
    auVar108._12_4_ = uVar99;
    auVar20 = vcmpps_avx(local_2a0,auVar108,2);
    uVar94 = vmovmskps_avx(auVar20);
    uVar100 = (ulong)((uint)uVar100 & uVar94);
    prim = (Primitive *)local_700._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }